

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCRayQueryContext *pRVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  byte bVar73;
  int iVar74;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar75;
  long lVar76;
  byte bVar77;
  undefined1 uVar78;
  undefined1 uVar79;
  ulong uVar80;
  uint uVar81;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar90 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar142 [32];
  uint uVar149;
  float pp;
  float fVar150;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar151;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar230 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar164;
  undefined4 uVar165;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar173 [32];
  undefined1 auVar166 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar242 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [28];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 (*local_848) [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  Primitive *local_6f0;
  ulong local_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  RTCHitN local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  fVar210 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar89 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar91 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar209 = fVar210 * auVar91._0_4_;
  fVar150 = fVar210 * auVar89._0_4_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar84);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar20);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar101 = vpmovsxbd_avx2(auVar82);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar102 = vpmovsxbd_avx2(auVar85);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar107 = vpmovsxbd_avx2(auVar5);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar72 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar71 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar104 = vpmovsxbd_avx2(auVar87);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar71 + uVar72 + 6);
  auVar105 = vpmovsxbd_avx2(auVar83);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar80 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar97 = vpmovsxbd_avx2(auVar88);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar117._4_4_ = fVar150;
  auVar117._0_4_ = fVar150;
  auVar117._8_4_ = fVar150;
  auVar117._12_4_ = fVar150;
  auVar117._16_4_ = fVar150;
  auVar117._20_4_ = fVar150;
  auVar117._24_4_ = fVar150;
  auVar117._28_4_ = fVar150;
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar210 * auVar89._12_4_,
                                CONCAT48(fVar210 * auVar89._8_4_,
                                         CONCAT44(fVar210 * auVar89._4_4_,fVar150))));
  auVar108 = vpermps_avx2(auVar119,auVar109);
  auVar96 = vpermps_avx512vl(auVar95,auVar109);
  fVar150 = auVar96._0_4_;
  fVar177 = auVar96._4_4_;
  auVar109._4_4_ = fVar177 * auVar101._4_4_;
  auVar109._0_4_ = fVar150 * auVar101._0_4_;
  fVar179 = auVar96._8_4_;
  auVar109._8_4_ = fVar179 * auVar101._8_4_;
  fVar181 = auVar96._12_4_;
  auVar109._12_4_ = fVar181 * auVar101._12_4_;
  fVar151 = auVar96._16_4_;
  auVar109._16_4_ = fVar151 * auVar101._16_4_;
  fVar183 = auVar96._20_4_;
  auVar109._20_4_ = fVar183 * auVar101._20_4_;
  fVar185 = auVar96._24_4_;
  auVar109._24_4_ = fVar185 * auVar101._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar99._4_4_ * fVar177;
  auVar107._0_4_ = auVar99._0_4_ * fVar150;
  auVar107._8_4_ = auVar99._8_4_ * fVar179;
  auVar107._12_4_ = auVar99._12_4_ * fVar181;
  auVar107._16_4_ = auVar99._16_4_ * fVar151;
  auVar107._20_4_ = auVar99._20_4_ * fVar183;
  auVar107._24_4_ = auVar99._24_4_ * fVar185;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar106._4_4_ * fVar177;
  auVar97._0_4_ = auVar106._0_4_ * fVar150;
  auVar97._8_4_ = auVar106._8_4_ * fVar179;
  auVar97._12_4_ = auVar106._12_4_ * fVar181;
  auVar97._16_4_ = auVar106._16_4_ * fVar151;
  auVar97._20_4_ = auVar106._20_4_ * fVar183;
  auVar97._24_4_ = auVar106._24_4_ * fVar185;
  auVar97._28_4_ = auVar96._28_4_;
  auVar84 = vfmadd231ps_fma(auVar109,auVar108,auVar98);
  auVar20 = vfmadd231ps_fma(auVar107,auVar108,auVar103);
  auVar82 = vfmadd231ps_fma(auVar97,auVar105,auVar108);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar117,auVar100);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar117,auVar102);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar104,auVar117);
  auVar118._4_4_ = fVar209;
  auVar118._0_4_ = fVar209;
  auVar118._8_4_ = fVar209;
  auVar118._12_4_ = fVar209;
  auVar118._16_4_ = fVar209;
  auVar118._20_4_ = fVar209;
  auVar118._24_4_ = fVar209;
  auVar118._28_4_ = fVar209;
  auVar97 = ZEXT1632(CONCAT412(fVar210 * auVar91._12_4_,
                               CONCAT48(fVar210 * auVar91._8_4_,
                                        CONCAT44(fVar210 * auVar91._4_4_,fVar209))));
  auVar107 = vpermps_avx2(auVar119,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  fVar210 = auVar97._0_4_;
  fVar150 = auVar97._4_4_;
  auVar108._4_4_ = fVar150 * auVar101._4_4_;
  auVar108._0_4_ = fVar210 * auVar101._0_4_;
  fVar177 = auVar97._8_4_;
  auVar108._8_4_ = fVar177 * auVar101._8_4_;
  fVar179 = auVar97._12_4_;
  auVar108._12_4_ = fVar179 * auVar101._12_4_;
  fVar181 = auVar97._16_4_;
  auVar108._16_4_ = fVar181 * auVar101._16_4_;
  fVar151 = auVar97._20_4_;
  auVar108._20_4_ = fVar151 * auVar101._20_4_;
  fVar183 = auVar97._24_4_;
  auVar108._24_4_ = fVar183 * auVar101._24_4_;
  auVar108._28_4_ = 1;
  auVar95._4_4_ = auVar99._4_4_ * fVar150;
  auVar95._0_4_ = auVar99._0_4_ * fVar210;
  auVar95._8_4_ = auVar99._8_4_ * fVar177;
  auVar95._12_4_ = auVar99._12_4_ * fVar179;
  auVar95._16_4_ = auVar99._16_4_ * fVar181;
  auVar95._20_4_ = auVar99._20_4_ * fVar151;
  auVar95._24_4_ = auVar99._24_4_ * fVar183;
  auVar95._28_4_ = auVar101._28_4_;
  auVar99._4_4_ = auVar106._4_4_ * fVar150;
  auVar99._0_4_ = auVar106._0_4_ * fVar210;
  auVar99._8_4_ = auVar106._8_4_ * fVar177;
  auVar99._12_4_ = auVar106._12_4_ * fVar179;
  auVar99._16_4_ = auVar106._16_4_ * fVar181;
  auVar99._20_4_ = auVar106._20_4_ * fVar151;
  auVar99._24_4_ = auVar106._24_4_ * fVar183;
  auVar99._28_4_ = auVar97._28_4_;
  auVar85 = vfmadd231ps_fma(auVar108,auVar107,auVar98);
  auVar5 = vfmadd231ps_fma(auVar95,auVar107,auVar103);
  auVar86 = vfmadd231ps_fma(auVar99,auVar107,auVar105);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar118,auVar100);
  auVar255 = ZEXT1664(auVar85);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar118,auVar102);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar118,auVar104);
  auVar100 = vandps_avx(ZEXT1632(auVar84),auVar114);
  auVar116._8_4_ = 0x219392ef;
  auVar116._0_8_ = 0x219392ef219392ef;
  auVar116._12_4_ = 0x219392ef;
  auVar116._16_4_ = 0x219392ef;
  auVar116._20_4_ = 0x219392ef;
  auVar116._24_4_ = 0x219392ef;
  auVar116._28_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar96._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar20),auVar114);
  uVar71 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar110._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar82),auVar114);
  uVar71 = vcmpps_avx512vl(auVar100,auVar116,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar100._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar115._16_4_ = 0x3f800000;
  auVar115._20_4_ = 0x3f800000;
  auVar115._24_4_ = 0x3f800000;
  auVar115._28_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar96,auVar98,auVar115);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar110);
  auVar20 = vfnmadd213ps_fma(auVar110,auVar98,auVar115);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar100);
  auVar82 = vfnmadd213ps_fma(auVar100,auVar98,auVar115);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar98,auVar98);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar85));
  auVar104._4_4_ = auVar84._4_4_ * auVar100._4_4_;
  auVar104._0_4_ = auVar84._0_4_ * auVar100._0_4_;
  auVar104._8_4_ = auVar84._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar84._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar85));
  auVar99 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar113._0_4_ = auVar84._0_4_ * auVar100._0_4_;
  auVar113._4_4_ = auVar84._4_4_ * auVar100._4_4_;
  auVar113._8_4_ = auVar84._8_4_ * auVar100._8_4_;
  auVar113._12_4_ = auVar84._12_4_ * auVar100._12_4_;
  auVar113._16_4_ = auVar100._16_4_ * 0.0;
  auVar113._20_4_ = auVar100._20_4_ * 0.0;
  auVar113._24_4_ = auVar100._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar72 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar5));
  auVar105._4_4_ = auVar20._4_4_ * auVar100._4_4_;
  auVar105._0_4_ = auVar20._0_4_ * auVar100._0_4_;
  auVar105._8_4_ = auVar20._8_4_ * auVar100._8_4_;
  auVar105._12_4_ = auVar20._12_4_ * auVar100._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * 0.0;
  auVar105._20_4_ = auVar100._20_4_ * 0.0;
  auVar105._24_4_ = auVar100._24_4_ * 0.0;
  auVar105._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar98);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar5));
  auVar112._0_4_ = auVar20._0_4_ * auVar100._0_4_;
  auVar112._4_4_ = auVar20._4_4_ * auVar100._4_4_;
  auVar112._8_4_ = auVar20._8_4_ * auVar100._8_4_;
  auVar112._12_4_ = auVar20._12_4_ * auVar100._12_4_;
  auVar112._16_4_ = auVar100._16_4_ * 0.0;
  auVar112._20_4_ = auVar100._20_4_ * 0.0;
  auVar112._24_4_ = auVar100._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + uVar72 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar106._4_4_ = auVar100._4_4_ * auVar82._4_4_;
  auVar106._0_4_ = auVar100._0_4_ * auVar82._0_4_;
  auVar106._8_4_ = auVar100._8_4_ * auVar82._8_4_;
  auVar106._12_4_ = auVar100._12_4_ * auVar82._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar86));
  auVar111._0_4_ = auVar82._0_4_ * auVar100._0_4_;
  auVar111._4_4_ = auVar82._4_4_ * auVar100._4_4_;
  auVar111._8_4_ = auVar82._8_4_ * auVar100._8_4_;
  auVar111._12_4_ = auVar82._12_4_ * auVar100._12_4_;
  auVar111._16_4_ = auVar100._16_4_ * 0.0;
  auVar111._20_4_ = auVar100._20_4_ * 0.0;
  auVar111._24_4_ = auVar100._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar104,auVar113);
  auVar98 = vpminsd_avx2(auVar105,auVar112);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98 = vpminsd_avx2(auVar106,auVar111);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar101._4_4_ = uVar165;
  auVar101._0_4_ = uVar165;
  auVar101._8_4_ = uVar165;
  auVar101._12_4_ = uVar165;
  auVar101._16_4_ = uVar165;
  auVar101._20_4_ = uVar165;
  auVar101._24_4_ = uVar165;
  auVar101._28_4_ = uVar165;
  auVar98 = vmaxps_avx512vl(auVar98,auVar101);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar100,auVar98);
  auVar100 = vpmaxsd_avx2(auVar104,auVar113);
  auVar98 = vpmaxsd_avx2(auVar105,auVar112);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar98 = vpmaxsd_avx2(auVar106,auVar111);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar102._4_4_ = uVar165;
  auVar102._0_4_ = uVar165;
  auVar102._8_4_ = uVar165;
  auVar102._12_4_ = uVar165;
  auVar102._16_4_ = uVar165;
  auVar102._20_4_ = uVar165;
  auVar102._24_4_ = uVar165;
  auVar102._28_4_ = uVar165;
  auVar98 = vminps_avx512vl(auVar98,auVar102);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar103._16_4_ = 0x3f800003;
  auVar103._20_4_ = 0x3f800003;
  auVar103._24_4_ = 0x3f800003;
  auVar103._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar103);
  uVar22 = vpcmpgtd_avx512vl(auVar99,_DAT_01fe9900);
  uVar21 = vcmpps_avx512vl(local_280,auVar100,2);
  if ((byte)((byte)uVar21 & (byte)uVar22) == 0) {
    return;
  }
  local_6e8 = (ulong)(byte)((byte)uVar21 & (byte)uVar22);
  local_848 = (undefined1 (*) [32])&local_340;
  local_4a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6f0 = prim;
LAB_01cdf38b:
  lVar76 = 0;
  for (uVar71 = local_6e8; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar76 = lVar76 + 1;
  }
  uVar75 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar76 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar75].ptr;
  lVar76 = *(long *)&pGVar9[1].time_range.upper;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar84 = *(undefined1 (*) [16])(lVar76 + (long)pGVar9[1].intersectionFilterN * uVar71);
  auVar20 = *(undefined1 (*) [16])(lVar76 + (long)pGVar9[1].intersectionFilterN * (uVar71 + 1));
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar85 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar82 = vunpcklps_avx512vl(local_520._0_16_,local_540._0_16_);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar88 = local_620._0_16_;
  local_810 = vinsertps_avx512f(auVar82,auVar88,0x28);
  auVar91._8_4_ = 0xbeaaaaab;
  auVar91._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar91._12_4_ = 0xbeaaaaab;
  auVar86 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar9[2].intersectionFilterN +
                              uVar71 * (long)pGVar9[2].pointQueryFunc),auVar84,auVar91);
  auVar5 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar9[2].intersectionFilterN +
                            (long)pGVar9[2].pointQueryFunc * (uVar71 + 1)),auVar20,auVar91);
  auVar92._0_4_ = auVar20._0_4_ + auVar84._0_4_ + auVar86._0_4_ + auVar5._0_4_;
  auVar92._4_4_ = auVar20._4_4_ + auVar84._4_4_ + auVar86._4_4_ + auVar5._4_4_;
  auVar92._8_4_ = auVar20._8_4_ + auVar84._8_4_ + auVar86._8_4_ + auVar5._8_4_;
  auVar92._12_4_ = auVar20._12_4_ + auVar84._12_4_ + auVar86._12_4_ + auVar5._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar82 = vmulps_avx512vl(auVar92,auVar89);
  auVar82 = vsubps_avx(auVar82,auVar85);
  auVar82 = vdpps_avx(auVar82,local_810,0x7f);
  fVar210 = *(float *)(ray + k * 4 + 0x60);
  local_820 = vdpps_avx(local_810,local_810,0x7f);
  auVar90._4_12_ = ZEXT812(0) << 0x20;
  auVar90._0_4_ = local_820._0_4_;
  auVar83 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar90);
  auVar87 = vfnmadd213ss_fma(auVar83,local_820,ZEXT416(0x40000000));
  local_260 = auVar82._0_4_ * auVar83._0_4_ * auVar87._0_4_;
  auVar93._4_4_ = local_260;
  auVar93._0_4_ = local_260;
  auVar93._8_4_ = local_260;
  auVar93._12_4_ = local_260;
  fStack_7d0 = local_260;
  _local_7e0 = auVar93;
  fStack_7cc = local_260;
  fStack_7c8 = local_260;
  fStack_7c4 = local_260;
  auVar82 = vfmadd231ps_fma(auVar85,local_810,auVar93);
  auVar82 = vblendps_avx(auVar82,ZEXT816(0) << 0x40,8);
  auVar84 = vsubps_avx(auVar84,auVar82);
  auVar85 = vsubps_avx(auVar5,auVar82);
  auVar5 = vsubps_avx(auVar86,auVar82);
  auVar20 = vsubps_avx(auVar20,auVar82);
  uVar165 = auVar84._0_4_;
  auVar248._4_4_ = uVar165;
  auVar248._0_4_ = uVar165;
  auVar248._8_4_ = uVar165;
  auVar248._12_4_ = uVar165;
  auVar248._16_4_ = uVar165;
  auVar248._20_4_ = uVar165;
  auVar248._24_4_ = uVar165;
  auVar248._28_4_ = uVar165;
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  local_660 = ZEXT1632(auVar84);
  auVar100 = vpermps_avx2(auVar121,local_660);
  auVar122._8_4_ = 2;
  auVar122._0_8_ = 0x200000002;
  auVar122._12_4_ = 2;
  auVar122._16_4_ = 2;
  auVar122._20_4_ = 2;
  auVar122._24_4_ = 2;
  auVar122._28_4_ = 2;
  auVar98 = vpermps_avx2(auVar122,local_660);
  auVar123._8_4_ = 3;
  auVar123._0_8_ = 0x300000003;
  auVar123._12_4_ = 3;
  auVar123._16_4_ = 3;
  auVar123._20_4_ = 3;
  auVar123._24_4_ = 3;
  auVar123._28_4_ = 3;
  local_8a0 = vpermps_avx2(auVar123,local_660);
  auVar254 = ZEXT3264(local_8a0);
  uVar165 = auVar5._0_4_;
  local_640._4_4_ = uVar165;
  local_640._0_4_ = uVar165;
  local_640._8_4_ = uVar165;
  local_640._12_4_ = uVar165;
  local_640._16_4_ = uVar165;
  local_640._20_4_ = uVar165;
  local_640._24_4_ = uVar165;
  local_640._28_4_ = uVar165;
  auVar244 = ZEXT3264(local_640);
  local_6a0 = ZEXT1632(auVar5);
  local_800 = vpermps_avx2(auVar121,local_6a0);
  auVar101 = vpermps_avx512vl(auVar122,local_6a0);
  auVar102 = vpermps_avx512vl(auVar123,local_6a0);
  auVar103 = vbroadcastss_avx512vl(auVar85);
  local_680 = ZEXT1632(auVar85);
  local_8c0 = vpermps_avx512vl(auVar121,local_680);
  auVar256 = ZEXT3264(local_8c0);
  local_8e0 = vpermps_avx512vl(auVar122,local_680);
  auVar257 = ZEXT3264(local_8e0);
  auVar99 = vpermps_avx512vl(auVar123,local_680);
  auVar233 = ZEXT3264(local_800);
  local_900 = vbroadcastss_avx512vl(auVar20);
  auVar258 = ZEXT3264(local_900);
  _local_6c0 = ZEXT1632(auVar20);
  auVar104 = vpermps_avx512vl(auVar121,_local_6c0);
  local_920 = vpermps_avx512vl(auVar122,_local_6c0);
  auVar259 = ZEXT3264(local_920);
  auVar105 = vpermps_avx512vl(auVar123,_local_6c0);
  auVar84 = vmulss_avx512f(auVar88,auVar88);
  auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_540,local_540);
  local_240 = vfmadd231ps_avx512vl(auVar106,_local_520,_local_520);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar120);
  local_750 = ZEXT416((uint)local_260);
  local_260 = fVar210 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_440 = vpbroadcastd_avx512vl();
  uVar71 = 0;
  iVar74 = 1;
  local_460 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_820,local_820);
  auVar20 = vsqrtss_avx(local_820,local_820);
  local_4b0 = ZEXT816(0x3f80000000000000);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar261 = ZEXT3264(auVar106);
  do {
    auVar82 = vmovshdup_avx(local_4b0);
    auVar82 = vsubps_avx(auVar82,local_4b0);
    fVar150 = auVar82._0_4_;
    fVar151 = fVar150 * 0.04761905;
    auVar223._0_4_ = local_4b0._0_4_;
    auVar223._4_4_ = auVar223._0_4_;
    auVar223._8_4_ = auVar223._0_4_;
    auVar223._12_4_ = auVar223._0_4_;
    auVar223._16_4_ = auVar223._0_4_;
    auVar223._20_4_ = auVar223._0_4_;
    auVar223._24_4_ = auVar223._0_4_;
    auVar223._28_4_ = auVar223._0_4_;
    auVar238._4_4_ = fVar150;
    auVar238._0_4_ = fVar150;
    auVar238._8_4_ = fVar150;
    auVar238._12_4_ = fVar150;
    auVar238._16_4_ = fVar150;
    auVar238._20_4_ = fVar150;
    auVar238._24_4_ = fVar150;
    auVar238._28_4_ = fVar150;
    auVar82 = vfmadd231ps_fma(auVar223,auVar238,_DAT_01faff20);
    auVar260 = auVar261._0_32_;
    auVar106 = vsubps_avx512vl(auVar260,ZEXT1632(auVar82));
    fVar150 = auVar82._0_4_;
    fVar177 = auVar82._4_4_;
    auVar65._4_4_ = auVar244._4_4_ * fVar177;
    auVar65._0_4_ = auVar244._0_4_ * fVar150;
    fVar179 = auVar82._8_4_;
    auVar65._8_4_ = auVar244._8_4_ * fVar179;
    fVar181 = auVar82._12_4_;
    auVar65._12_4_ = auVar244._12_4_ * fVar181;
    auVar65._16_4_ = auVar244._16_4_ * 0.0;
    auVar65._20_4_ = auVar244._20_4_ * 0.0;
    auVar65._24_4_ = auVar244._24_4_ * 0.0;
    auVar65._28_4_ = DAT_01faff20._28_4_;
    auVar108 = ZEXT1632(auVar82);
    auVar130._4_4_ = auVar233._4_4_ * fVar177;
    auVar130._0_4_ = auVar233._0_4_ * fVar150;
    auVar130._8_4_ = auVar233._8_4_ * fVar179;
    auVar130._12_4_ = auVar233._12_4_ * fVar181;
    auVar130._16_4_ = auVar233._16_4_ * 0.0;
    auVar130._20_4_ = auVar233._20_4_ * 0.0;
    auVar130._24_4_ = auVar233._24_4_ * 0.0;
    auVar130._28_4_ = auVar223._0_4_;
    auVar107 = vmulps_avx512vl(auVar101,auVar108);
    auVar97 = vmulps_avx512vl(auVar102,auVar108);
    auVar85 = vfmadd231ps_fma(auVar65,auVar106,auVar248);
    auVar5 = vfmadd231ps_fma(auVar130,auVar106,auVar100);
    auVar86 = vfmadd231ps_fma(auVar107,auVar106,auVar98);
    auVar87 = vfmadd231ps_fma(auVar97,auVar106,auVar254._0_32_);
    auVar107 = vmulps_avx512vl(auVar103,auVar108);
    auVar110 = ZEXT1632(auVar82);
    auVar97 = vmulps_avx512vl(auVar256._0_32_,auVar110);
    auVar108 = vmulps_avx512vl(auVar257._0_32_,auVar110);
    auVar109 = vmulps_avx512vl(auVar99,auVar110);
    auVar83 = vfmadd231ps_fma(auVar107,auVar106,auVar244._0_32_);
    auVar88 = vfmadd231ps_fma(auVar97,auVar106,auVar233._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar101);
    auVar97 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar102);
    auVar108 = vmulps_avx512vl(auVar258._0_32_,auVar110);
    auVar109 = vmulps_avx512vl(auVar104,auVar110);
    auVar95 = vmulps_avx512vl(auVar259._0_32_,auVar110);
    auVar96 = vmulps_avx512vl(auVar105,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar256._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,auVar257._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar106,auVar99);
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(fVar181 * auVar83._12_4_,
                            CONCAT48(fVar179 * auVar83._8_4_,
                                     CONCAT44(fVar177 * auVar83._4_4_,fVar150 * auVar83._0_4_))));
    auVar110 = vmulps_avx512vl(auVar110,ZEXT1632(auVar88));
    auVar111 = vmulps_avx512vl(ZEXT1632(auVar82),auVar107);
    auVar112 = vmulps_avx512vl(ZEXT1632(auVar82),auVar97);
    auVar82 = vfmadd231ps_fma(auVar255._0_32_,auVar106,ZEXT1632(auVar85));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,ZEXT1632(auVar5));
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,ZEXT1632(auVar86));
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar87));
    auVar242._0_4_ = auVar108._0_4_ * fVar150;
    auVar242._4_4_ = auVar108._4_4_ * fVar177;
    auVar242._8_4_ = auVar108._8_4_ * fVar179;
    auVar242._12_4_ = auVar108._12_4_ * fVar181;
    auVar242._16_4_ = auVar108._16_4_ * 0.0;
    auVar242._20_4_ = auVar108._20_4_ * 0.0;
    auVar242._24_4_ = auVar108._24_4_ * 0.0;
    auVar242._28_4_ = 0;
    auVar131._4_4_ = auVar109._4_4_ * fVar177;
    auVar131._0_4_ = auVar109._0_4_ * fVar150;
    auVar131._8_4_ = auVar109._8_4_ * fVar179;
    auVar131._12_4_ = auVar109._12_4_ * fVar181;
    auVar131._16_4_ = auVar109._16_4_ * 0.0;
    auVar131._20_4_ = auVar109._20_4_ * 0.0;
    auVar131._24_4_ = auVar109._24_4_ * 0.0;
    auVar131._28_4_ = auVar108._28_4_;
    auVar40._4_4_ = auVar95._4_4_ * fVar177;
    auVar40._0_4_ = auVar95._0_4_ * fVar150;
    auVar40._8_4_ = auVar95._8_4_ * fVar179;
    auVar40._12_4_ = auVar95._12_4_ * fVar181;
    auVar40._16_4_ = auVar95._16_4_ * 0.0;
    auVar40._20_4_ = auVar95._20_4_ * 0.0;
    auVar40._24_4_ = auVar95._24_4_ * 0.0;
    auVar40._28_4_ = auVar109._28_4_;
    auVar41._4_4_ = auVar96._4_4_ * fVar177;
    auVar41._0_4_ = auVar96._0_4_ * fVar150;
    auVar41._8_4_ = auVar96._8_4_ * fVar179;
    auVar41._12_4_ = auVar96._12_4_ * fVar181;
    auVar41._16_4_ = auVar96._16_4_ * 0.0;
    auVar41._20_4_ = auVar96._20_4_ * 0.0;
    auVar41._24_4_ = auVar96._24_4_ * 0.0;
    auVar41._28_4_ = auVar95._28_4_;
    auVar85 = vfmadd231ps_fma(auVar242,auVar106,ZEXT1632(auVar83));
    auVar5 = vfmadd231ps_fma(auVar131,auVar106,ZEXT1632(auVar88));
    auVar86 = vfmadd231ps_fma(auVar40,auVar106,auVar107);
    auVar87 = vfmadd231ps_fma(auVar41,auVar106,auVar97);
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar181 * auVar85._12_4_,
                                                 CONCAT48(fVar179 * auVar85._8_4_,
                                                          CONCAT44(fVar177 * auVar85._4_4_,
                                                                   fVar150 * auVar85._0_4_)))),
                              auVar106,ZEXT1632(auVar82));
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar5._12_4_ * fVar181,
                                            CONCAT48(auVar5._8_4_ * fVar179,
                                                     CONCAT44(auVar5._4_4_ * fVar177,
                                                              auVar5._0_4_ * fVar150)))),auVar106,
                         auVar110);
    auVar113 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar181,
                                             CONCAT48(auVar86._8_4_ * fVar179,
                                                      CONCAT44(auVar86._4_4_ * fVar177,
                                                               auVar86._0_4_ * fVar150)))),auVar106,
                          auVar111);
    auVar107 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar87._12_4_ * fVar181,
                                             CONCAT48(auVar87._8_4_ * fVar179,
                                                      CONCAT44(auVar87._4_4_ * fVar177,
                                                               auVar87._0_4_ * fVar150)))),auVar112,
                          auVar106);
    auVar106 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar82));
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar5),auVar110);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar86),auVar111);
    auVar109 = vsubps_avx512vl(ZEXT1632(auVar87),auVar112);
    auVar252._0_4_ = fVar151 * auVar106._0_4_ * 3.0;
    auVar252._4_4_ = fVar151 * auVar106._4_4_ * 3.0;
    auVar252._8_4_ = fVar151 * auVar106._8_4_ * 3.0;
    auVar252._12_4_ = fVar151 * auVar106._12_4_ * 3.0;
    auVar252._16_4_ = fVar151 * auVar106._16_4_ * 3.0;
    auVar252._20_4_ = fVar151 * auVar106._20_4_ * 3.0;
    auVar252._24_4_ = fVar151 * auVar106._24_4_ * 3.0;
    auVar252._28_4_ = 0;
    auVar253._0_4_ = fVar151 * auVar97._0_4_ * 3.0;
    auVar253._4_4_ = fVar151 * auVar97._4_4_ * 3.0;
    auVar253._8_4_ = fVar151 * auVar97._8_4_ * 3.0;
    auVar253._12_4_ = fVar151 * auVar97._12_4_ * 3.0;
    auVar253._16_4_ = fVar151 * auVar97._16_4_ * 3.0;
    auVar253._20_4_ = fVar151 * auVar97._20_4_ * 3.0;
    auVar253._24_4_ = fVar151 * auVar97._24_4_ * 3.0;
    auVar253._28_4_ = 0;
    auVar42._4_4_ = fVar151 * auVar108._4_4_ * 3.0;
    auVar42._0_4_ = fVar151 * auVar108._0_4_ * 3.0;
    auVar42._8_4_ = fVar151 * auVar108._8_4_ * 3.0;
    auVar42._12_4_ = fVar151 * auVar108._12_4_ * 3.0;
    auVar42._16_4_ = fVar151 * auVar108._16_4_ * 3.0;
    auVar42._20_4_ = fVar151 * auVar108._20_4_ * 3.0;
    auVar42._24_4_ = fVar151 * auVar108._24_4_ * 3.0;
    auVar42._28_4_ = auVar96._28_4_;
    fVar150 = auVar109._0_4_ * 3.0 * fVar151;
    fVar177 = auVar109._4_4_ * 3.0 * fVar151;
    auVar43._4_4_ = fVar177;
    auVar43._0_4_ = fVar150;
    fVar179 = auVar109._8_4_ * 3.0 * fVar151;
    auVar43._8_4_ = fVar179;
    fVar181 = auVar109._12_4_ * 3.0 * fVar151;
    auVar43._12_4_ = fVar181;
    fVar183 = auVar109._16_4_ * 3.0 * fVar151;
    auVar43._16_4_ = fVar183;
    fVar185 = auVar109._20_4_ * 3.0 * fVar151;
    auVar43._20_4_ = fVar185;
    fVar209 = auVar109._24_4_ * 3.0 * fVar151;
    auVar43._24_4_ = fVar209;
    auVar43._28_4_ = fVar151;
    auVar82 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar82);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar83),_DAT_01feed00,ZEXT1632(auVar82));
    auVar110 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar82));
    auVar97 = ZEXT1632(auVar82);
    auVar111 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar97);
    auVar239._0_4_ = auVar107._0_4_ + fVar150;
    auVar239._4_4_ = auVar107._4_4_ + fVar177;
    auVar239._8_4_ = auVar107._8_4_ + fVar179;
    auVar239._12_4_ = auVar107._12_4_ + fVar181;
    auVar239._16_4_ = auVar107._16_4_ + fVar183;
    auVar239._20_4_ = auVar107._20_4_ + fVar185;
    auVar239._24_4_ = auVar107._24_4_ + fVar209;
    auVar239._28_4_ = auVar107._28_4_ + fVar151;
    auVar106 = vmaxps_avx(auVar107,auVar239);
    auVar112 = vminps_avx512vl(auVar107,auVar239);
    auVar114 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar97);
    auVar115 = vpermt2ps_avx512vl(auVar252,_DAT_01feed00,auVar97);
    auVar116 = vpermt2ps_avx512vl(auVar253,_DAT_01feed00,auVar97);
    auVar130 = ZEXT1632(auVar82);
    auVar117 = vpermt2ps_avx512vl(auVar42,_DAT_01feed00,auVar130);
    auVar107 = vpermt2ps_avx512vl(auVar43,_DAT_01feed00,auVar130);
    auVar107 = vsubps_avx(auVar114,auVar107);
    auVar97 = vsubps_avx(auVar96,ZEXT1632(auVar83));
    auVar108 = vsubps_avx(auVar110,auVar95);
    auVar109 = vsubps_avx(auVar111,auVar113);
    auVar118 = vmulps_avx512vl(auVar108,auVar42);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar253,auVar109);
    auVar119 = vmulps_avx512vl(auVar109,auVar252);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar42,auVar97);
    auVar120 = vmulps_avx512vl(auVar97,auVar253);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar252,auVar108);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar119 = vmulps_avx512vl(auVar109,auVar109);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar108,auVar108);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar97,auVar97);
    auVar120 = vrcp14ps_avx512vl(auVar119);
    auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar260);
    auVar120 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
    auVar118 = vmulps_avx512vl(auVar118,auVar120);
    auVar121 = vmulps_avx512vl(auVar108,auVar117);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar116,auVar109);
    auVar122 = vmulps_avx512vl(auVar109,auVar115);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar117,auVar97);
    auVar123 = vmulps_avx512vl(auVar97,auVar116);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar115,auVar108);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vmulps_avx512vl(auVar121,auVar120);
    auVar118 = vmaxps_avx512vl(auVar118,auVar120);
    auVar118 = vsqrtps_avx512vl(auVar118);
    auVar120 = vmaxps_avx512vl(auVar107,auVar114);
    auVar106 = vmaxps_avx512vl(auVar106,auVar120);
    auVar120 = vaddps_avx512vl(auVar118,auVar106);
    auVar106 = vminps_avx(auVar107,auVar114);
    auVar106 = vminps_avx512vl(auVar112,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar118);
    auVar124._8_4_ = 0x3f800002;
    auVar124._0_8_ = 0x3f8000023f800002;
    auVar124._12_4_ = 0x3f800002;
    auVar124._16_4_ = 0x3f800002;
    auVar124._20_4_ = 0x3f800002;
    auVar124._24_4_ = 0x3f800002;
    auVar124._28_4_ = 0x3f800002;
    auVar107 = vmulps_avx512vl(auVar120,auVar124);
    auVar125._8_4_ = 0x3f7ffffc;
    auVar125._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar125._12_4_ = 0x3f7ffffc;
    auVar125._16_4_ = 0x3f7ffffc;
    auVar125._20_4_ = 0x3f7ffffc;
    auVar125._24_4_ = 0x3f7ffffc;
    auVar125._28_4_ = 0x3f7ffffc;
    local_880 = vmulps_avx512vl(auVar106,auVar125);
    auVar106 = vmulps_avx512vl(auVar107,auVar107);
    auVar107 = vrsqrt14ps_avx512vl(auVar119);
    auVar230._8_4_ = 0xbf000000;
    auVar230._0_8_ = 0xbf000000bf000000;
    auVar230._12_4_ = 0xbf000000;
    auVar230._16_4_ = 0xbf000000;
    auVar230._20_4_ = 0xbf000000;
    auVar230._24_4_ = 0xbf000000;
    auVar230._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar119,auVar230);
    fVar150 = auVar107._0_4_;
    fVar177 = auVar107._4_4_;
    fVar179 = auVar107._8_4_;
    fVar181 = auVar107._12_4_;
    fVar151 = auVar107._16_4_;
    fVar183 = auVar107._20_4_;
    fVar185 = auVar107._24_4_;
    auVar44._4_4_ = fVar177 * fVar177 * fVar177 * auVar112._4_4_;
    auVar44._0_4_ = fVar150 * fVar150 * fVar150 * auVar112._0_4_;
    auVar44._8_4_ = fVar179 * fVar179 * fVar179 * auVar112._8_4_;
    auVar44._12_4_ = fVar181 * fVar181 * fVar181 * auVar112._12_4_;
    auVar44._16_4_ = fVar151 * fVar151 * fVar151 * auVar112._16_4_;
    auVar44._20_4_ = fVar183 * fVar183 * fVar183 * auVar112._20_4_;
    auVar44._24_4_ = fVar185 * fVar185 * fVar185 * auVar112._24_4_;
    auVar44._28_4_ = auVar120._28_4_;
    auVar126._8_4_ = 0x3fc00000;
    auVar126._0_8_ = 0x3fc000003fc00000;
    auVar126._12_4_ = 0x3fc00000;
    auVar126._16_4_ = 0x3fc00000;
    auVar126._20_4_ = 0x3fc00000;
    auVar126._24_4_ = 0x3fc00000;
    auVar126._28_4_ = 0x3fc00000;
    auVar107 = vfmadd231ps_avx512vl(auVar44,auVar107,auVar126);
    auVar255 = ZEXT3264(auVar107);
    auVar112 = vmulps_avx512vl(auVar97,auVar107);
    auVar114 = vmulps_avx512vl(auVar108,auVar107);
    auVar118 = vmulps_avx512vl(auVar109,auVar107);
    auVar230 = ZEXT1632(auVar83);
    auVar119 = vsubps_avx512vl(auVar130,auVar230);
    auVar120 = vsubps_avx512vl(auVar130,auVar95);
    auVar121 = vsubps_avx512vl(auVar130,auVar113);
    auVar122 = vmulps_avx512vl(local_620,auVar121);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_540,auVar120);
    auVar122 = vfmadd231ps_avx512vl(auVar122,_local_520,auVar119);
    auVar123 = vmulps_avx512vl(auVar121,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar119);
    auVar124 = vmulps_avx512vl(local_620,auVar118);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar114,local_540);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar112,_local_520);
    auVar118 = vmulps_avx512vl(auVar121,auVar118);
    auVar114 = vfmadd231ps_avx512vl(auVar118,auVar120,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar114,auVar119,auVar112);
    auVar114 = vmulps_avx512vl(auVar124,auVar124);
    auVar118 = vsubps_avx512vl(local_220,auVar114);
    auVar125 = vmulps_avx512vl(auVar124,auVar112);
    auVar122 = vsubps_avx512vl(auVar122,auVar125);
    auVar122 = vaddps_avx512vl(auVar122,auVar122);
    auVar125 = vmulps_avx512vl(auVar112,auVar112);
    local_7a0 = vsubps_avx512vl(auVar123,auVar125);
    auVar106 = vsubps_avx512vl(local_7a0,auVar106);
    local_560 = vmulps_avx512vl(auVar122,auVar122);
    auVar127._8_4_ = 0x40800000;
    auVar127._0_8_ = 0x4080000040800000;
    auVar127._12_4_ = 0x40800000;
    auVar127._16_4_ = 0x40800000;
    auVar127._20_4_ = 0x40800000;
    auVar127._24_4_ = 0x40800000;
    auVar127._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar118,auVar127);
    auVar123 = vmulps_avx512vl(_local_580,auVar106);
    auVar123 = vsubps_avx512vl(local_560,auVar123);
    uVar80 = vcmpps_avx512vl(auVar123,auVar130,5);
    bVar66 = (byte)uVar80;
    fVar150 = (float)local_7e0._0_4_;
    fVar177 = (float)local_7e0._4_4_;
    fVar179 = fStack_7d8;
    fVar181 = fStack_7d4;
    fVar151 = fStack_7d0;
    fVar183 = fStack_7cc;
    fVar185 = fStack_7c8;
    fVar209 = fStack_7c4;
    if (bVar66 == 0) {
LAB_01cdffad:
      auVar254 = ZEXT3264(local_8a0);
      auVar244 = ZEXT3264(local_640);
      auVar233 = ZEXT3264(local_800);
      auVar256 = ZEXT3264(local_8c0);
      auVar257 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      auVar259 = ZEXT3264(local_920);
    }
    else {
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar125 = vaddps_avx512vl(auVar118,auVar118);
      local_600 = vrcp14ps_avx512vl(auVar125);
      in_ZMM31 = ZEXT3264(local_600);
      auVar126 = vfnmadd213ps_avx512vl(local_600,auVar125,auVar260);
      auVar126 = vfmadd132ps_avx512vl(auVar126,local_600,local_600);
      auVar260._8_4_ = 0x80000000;
      auVar260._0_8_ = 0x8000000080000000;
      auVar260._12_4_ = 0x80000000;
      auVar260._16_4_ = 0x80000000;
      auVar260._20_4_ = 0x80000000;
      auVar260._24_4_ = 0x80000000;
      auVar260._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar122,auVar260);
      auVar127 = vsubps_avx512vl(local_5a0,auVar123);
      local_7c0 = vmulps_avx512vl(auVar127,auVar126);
      auVar123 = vsubps_avx512vl(auVar123,auVar122);
      local_840 = vmulps_avx512vl(auVar123,auVar126);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126 = vblendmps_avx512vl(auVar123,local_7c0);
      auVar128._0_4_ =
           (uint)(bVar66 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar123._0_4_;
      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar12 * auVar126._4_4_ | (uint)!bVar12 * auVar123._4_4_;
      bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar12 * auVar126._8_4_ | (uint)!bVar12 * auVar123._8_4_;
      bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar12 * auVar126._12_4_ | (uint)!bVar12 * auVar123._12_4_;
      bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar12 * auVar126._16_4_ | (uint)!bVar12 * auVar123._16_4_;
      bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar12 * auVar126._20_4_ | (uint)!bVar12 * auVar123._20_4_;
      bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar12 * auVar126._24_4_ | (uint)!bVar12 * auVar123._24_4_;
      bVar12 = SUB81(uVar80 >> 7,0);
      auVar128._28_4_ = (uint)bVar12 * auVar126._28_4_ | (uint)!bVar12 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar126 = vblendmps_avx512vl(auVar123,local_840);
      auVar129._0_4_ =
           (uint)(bVar66 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar123._0_4_;
      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar12 * auVar126._4_4_ | (uint)!bVar12 * auVar123._4_4_;
      bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar12 * auVar126._8_4_ | (uint)!bVar12 * auVar123._8_4_;
      bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar12 * auVar126._12_4_ | (uint)!bVar12 * auVar123._12_4_;
      bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar129._16_4_ = (uint)bVar12 * auVar126._16_4_ | (uint)!bVar12 * auVar123._16_4_;
      bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar129._20_4_ = (uint)bVar12 * auVar126._20_4_ | (uint)!bVar12 * auVar123._20_4_;
      bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar129._24_4_ = (uint)bVar12 * auVar126._24_4_ | (uint)!bVar12 * auVar123._24_4_;
      bVar12 = SUB81(uVar80 >> 7,0);
      auVar129._28_4_ = (uint)bVar12 * auVar126._28_4_ | (uint)!bVar12 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar123);
      local_5c0 = vmaxps_avx512vl(local_240,auVar123);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar34);
      vandps_avx512vl(auVar118,auVar123);
      uVar72 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar80 = uVar80 & uVar72;
      bVar68 = (byte)uVar80;
      if (bVar68 != 0) {
        uVar72 = vcmpps_avx512vl(auVar106,_DAT_01faff00,2);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar118 = vblendmps_avx512vl(auVar106,auVar114);
        bVar73 = (byte)uVar72;
        uVar81 = (uint)(bVar73 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar73 & 1) * local_5e0._0_4_;
        bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar70 = (uint)bVar12 * auVar118._4_4_ | (uint)!bVar12 * local_5e0._4_4_;
        bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar143 = (uint)bVar12 * auVar118._8_4_ | (uint)!bVar12 * local_5e0._8_4_;
        bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar144 = (uint)bVar12 * auVar118._12_4_ | (uint)!bVar12 * local_5e0._12_4_;
        bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar145 = (uint)bVar12 * auVar118._16_4_ | (uint)!bVar12 * local_5e0._16_4_;
        bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar146 = (uint)bVar12 * auVar118._20_4_ | (uint)!bVar12 * local_5e0._20_4_;
        bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar147 = (uint)bVar12 * auVar118._24_4_ | (uint)!bVar12 * local_5e0._24_4_;
        bVar12 = SUB81(uVar72 >> 7,0);
        uVar148 = (uint)bVar12 * auVar118._28_4_ | (uint)!bVar12 * local_5e0._28_4_;
        auVar128._0_4_ = (bVar68 & 1) * uVar81 | !(bool)(bVar68 & 1) * auVar128._0_4_;
        bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar128._4_4_ = bVar12 * uVar70 | !bVar12 * auVar128._4_4_;
        bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar128._8_4_ = bVar12 * uVar143 | !bVar12 * auVar128._8_4_;
        bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar128._12_4_ = bVar12 * uVar144 | !bVar12 * auVar128._12_4_;
        bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar128._16_4_ = bVar12 * uVar145 | !bVar12 * auVar128._16_4_;
        bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar128._20_4_ = bVar12 * uVar146 | !bVar12 * auVar128._20_4_;
        bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar128._24_4_ = bVar12 * uVar147 | !bVar12 * auVar128._24_4_;
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar128._28_4_ = bVar12 * uVar148 | !bVar12 * auVar128._28_4_;
        auVar106 = vblendmps_avx512vl(auVar114,auVar106);
        bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar19 = SUB81(uVar72 >> 7,0);
        auVar129._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar73 & 1) * auVar106._0_4_ | !(bool)(bVar73 & 1) * uVar81) |
             !(bool)(bVar68 & 1) * auVar129._0_4_;
        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar129._4_4_ =
             (uint)bVar13 * ((uint)bVar12 * auVar106._4_4_ | !bVar12 * uVar70) |
             !bVar13 * auVar129._4_4_;
        bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar129._8_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar106._8_4_ | !bVar14 * uVar143) |
             !bVar12 * auVar129._8_4_;
        bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar129._12_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar106._12_4_ | !bVar15 * uVar144) |
             !bVar12 * auVar129._12_4_;
        bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar129._16_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar106._16_4_ | !bVar16 * uVar145) |
             !bVar12 * auVar129._16_4_;
        bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar129._20_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar106._20_4_ | !bVar17 * uVar146) |
             !bVar12 * auVar129._20_4_;
        bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar129._24_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar106._24_4_ | !bVar18 * uVar147) |
             !bVar12 * auVar129._24_4_;
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar129._28_4_ =
             (uint)bVar12 * ((uint)bVar19 * auVar106._28_4_ | !bVar19 * uVar148) |
             !bVar12 * auVar129._28_4_;
        bVar66 = (~bVar68 | bVar73) & bVar66;
      }
      if ((bVar66 & 0x7f) == 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar106);
        goto LAB_01cdffad;
      }
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar117 = vxorps_avx512vl(auVar117,auVar114);
      auVar115 = vxorps_avx512vl(auVar115,auVar114);
      uVar81 = *(uint *)(ray + k * 4 + 0x100);
      auVar116 = vxorps_avx512vl(auVar116,auVar114);
      auVar82 = vsubss_avx512f(ZEXT416(uVar81),ZEXT416((uint)local_750._0_4_));
      auVar106 = vbroadcastss_avx512vl(auVar82);
      auVar118 = vminps_avx512vl(auVar106,auVar129);
      auVar64._4_4_ = fStack_25c;
      auVar64._0_4_ = local_260;
      auVar64._8_4_ = fStack_258;
      auVar64._12_4_ = fStack_254;
      auVar64._16_4_ = fStack_250;
      auVar64._20_4_ = fStack_24c;
      auVar64._24_4_ = fStack_248;
      auVar64._28_4_ = fStack_244;
      auVar106 = vmaxps_avx512vl(auVar64,auVar128);
      auVar121 = vmulps_avx512vl(auVar121,auVar42);
      auVar120 = vfmadd213ps_avx512vl(auVar120,auVar253,auVar121);
      auVar82 = vfmadd213ps_fma(auVar119,auVar252,auVar120);
      in_ZMM31 = ZEXT3264(local_620);
      auVar119 = vmulps_avx512vl(local_620,auVar42);
      auVar119 = vfmadd231ps_avx512vl(auVar119,local_540,auVar253);
      auVar119 = vfmadd231ps_avx512vl(auVar119,_local_520,auVar252);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar120);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar120,auVar121,1);
      auVar123 = vxorps_avx512vl(ZEXT1632(auVar82),auVar114);
      auVar126 = vrcp14ps_avx512vl(auVar119);
      auVar127 = vxorps_avx512vl(auVar119,auVar114);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar131 = vfnmadd213ps_avx512vl(auVar126,auVar119,auVar130);
      auVar82 = vfmadd132ps_fma(auVar131,auVar126,auVar126);
      fVar164 = auVar82._0_4_ * auVar123._0_4_;
      fVar178 = auVar82._4_4_ * auVar123._4_4_;
      auVar45._4_4_ = fVar178;
      auVar45._0_4_ = fVar164;
      fVar180 = auVar82._8_4_ * auVar123._8_4_;
      auVar45._8_4_ = fVar180;
      fVar182 = auVar82._12_4_ * auVar123._12_4_;
      auVar45._12_4_ = fVar182;
      fVar184 = auVar123._16_4_ * 0.0;
      auVar45._16_4_ = fVar184;
      fVar186 = auVar123._20_4_ * 0.0;
      auVar45._20_4_ = fVar186;
      fVar187 = auVar123._24_4_ * 0.0;
      auVar45._24_4_ = fVar187;
      auVar45._28_4_ = auVar123._28_4_;
      uVar22 = vcmpps_avx512vl(auVar119,auVar127,1);
      bVar68 = (byte)uVar21 | (byte)uVar22;
      auVar249._8_4_ = 0xff800000;
      auVar249._0_8_ = 0xff800000ff800000;
      auVar249._12_4_ = 0xff800000;
      auVar249._16_4_ = 0xff800000;
      auVar249._20_4_ = 0xff800000;
      auVar249._24_4_ = 0xff800000;
      auVar249._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar45,auVar249);
      auVar132._0_4_ =
           (uint)(bVar68 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar126._0_4_;
      bVar12 = (bool)(bVar68 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar12 * auVar131._4_4_ | (uint)!bVar12 * auVar126._4_4_;
      bVar12 = (bool)(bVar68 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar12 * auVar131._8_4_ | (uint)!bVar12 * auVar126._8_4_;
      bVar12 = (bool)(bVar68 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar12 * auVar131._12_4_ | (uint)!bVar12 * auVar126._12_4_;
      bVar12 = (bool)(bVar68 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar12 * auVar131._16_4_ | (uint)!bVar12 * auVar126._16_4_;
      bVar12 = (bool)(bVar68 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar12 * auVar131._20_4_ | (uint)!bVar12 * auVar126._20_4_;
      bVar12 = (bool)(bVar68 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar12 * auVar131._24_4_ | (uint)!bVar12 * auVar126._24_4_;
      auVar132._28_4_ =
           (uint)(bVar68 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar126._28_4_;
      auVar126 = vmaxps_avx512vl(auVar106,auVar132);
      uVar22 = vcmpps_avx512vl(auVar119,auVar127,6);
      bVar68 = (byte)uVar21 | (byte)uVar22;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar133._0_4_ =
           (uint)(bVar68 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar68 & 1) * (int)fVar164;
      bVar12 = (bool)(bVar68 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * (int)fVar178;
      bVar12 = (bool)(bVar68 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * (int)fVar180;
      bVar12 = (bool)(bVar68 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * (int)fVar182;
      bVar12 = (bool)(bVar68 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * (int)fVar184;
      bVar12 = (bool)(bVar68 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * (int)fVar186;
      bVar12 = (bool)(bVar68 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * (int)fVar187;
      auVar133._28_4_ =
           (uint)(bVar68 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar123._28_4_;
      auVar123 = vminps_avx512vl(auVar118,auVar133);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,auVar96);
      auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar127 = ZEXT832(0) << 0x20;
      auVar110 = vsubps_avx(auVar127,auVar111);
      auVar110 = vmulps_avx512vl(auVar110,auVar117);
      auVar96 = vfmadd231ps_avx512vl(auVar110,auVar116,auVar96);
      auVar106 = vfmadd231ps_avx512vl(auVar96,auVar115,auVar106);
      auVar96 = vmulps_avx512vl(local_620,auVar117);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_540,auVar116);
      auVar96 = vfmadd231ps_avx512vl(auVar96,_local_520,auVar115);
      vandps_avx512vl(auVar96,auVar120);
      uVar21 = vcmpps_avx512vl(auVar96,auVar121,1);
      auVar106 = vxorps_avx512vl(auVar106,auVar114);
      auVar110 = vrcp14ps_avx512vl(auVar96);
      auVar111 = vxorps_avx512vl(auVar96,auVar114);
      auVar114 = vfnmadd213ps_avx512vl(auVar110,auVar96,auVar130);
      auVar82 = vfmadd132ps_fma(auVar114,auVar110,auVar110);
      fVar164 = auVar82._0_4_ * auVar106._0_4_;
      fVar178 = auVar82._4_4_ * auVar106._4_4_;
      auVar46._4_4_ = fVar178;
      auVar46._0_4_ = fVar164;
      fVar180 = auVar82._8_4_ * auVar106._8_4_;
      auVar46._8_4_ = fVar180;
      fVar182 = auVar82._12_4_ * auVar106._12_4_;
      auVar46._12_4_ = fVar182;
      fVar184 = auVar106._16_4_ * 0.0;
      auVar46._16_4_ = fVar184;
      fVar186 = auVar106._20_4_ * 0.0;
      auVar46._20_4_ = fVar186;
      fVar187 = auVar106._24_4_ * 0.0;
      auVar46._24_4_ = fVar187;
      auVar46._28_4_ = auVar106._28_4_;
      uVar22 = vcmpps_avx512vl(auVar96,auVar111,1);
      bVar68 = (byte)uVar21 | (byte)uVar22;
      auVar114 = vblendmps_avx512vl(auVar46,auVar249);
      auVar134._0_4_ =
           (uint)(bVar68 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar110._0_4_;
      bVar12 = (bool)(bVar68 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar110._4_4_;
      bVar12 = (bool)(bVar68 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar110._8_4_;
      bVar12 = (bool)(bVar68 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar110._12_4_;
      bVar12 = (bool)(bVar68 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * auVar110._16_4_;
      bVar12 = (bool)(bVar68 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * auVar110._20_4_;
      bVar12 = (bool)(bVar68 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * auVar110._24_4_;
      auVar134._28_4_ =
           (uint)(bVar68 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar110._28_4_;
      _local_6e0 = vmaxps_avx(auVar126,auVar134);
      uVar22 = vcmpps_avx512vl(auVar96,auVar111,6);
      bVar68 = (byte)uVar21 | (byte)uVar22;
      auVar135._0_4_ =
           (uint)(bVar68 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar68 & 1) * (int)fVar164;
      bVar12 = (bool)(bVar68 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * (int)fVar178;
      bVar12 = (bool)(bVar68 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * (int)fVar180;
      bVar12 = (bool)(bVar68 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * (int)fVar182;
      bVar12 = (bool)(bVar68 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar12 * auVar119._16_4_ | (uint)!bVar12 * (int)fVar184;
      bVar12 = (bool)(bVar68 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar12 * auVar119._20_4_ | (uint)!bVar12 * (int)fVar186;
      bVar12 = (bool)(bVar68 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar12 * auVar119._24_4_ | (uint)!bVar12 * (int)fVar187;
      auVar135._28_4_ =
           (uint)(bVar68 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar106._28_4_;
      local_2e0 = vminps_avx(auVar123,auVar135);
      uVar21 = vcmpps_avx512vl(_local_6e0,local_2e0,2);
      bVar66 = bVar66 & 0x7f & (byte)uVar21;
      if (bVar66 == 0) {
        auVar261 = ZEXT3264(auVar130);
        goto LAB_01cdffad;
      }
      auVar106 = vmaxps_avx(auVar127,local_880);
      auVar96 = vfmadd213ps_avx512vl(local_7c0,auVar124,auVar112);
      fVar164 = auVar107._0_4_;
      fVar178 = auVar107._4_4_;
      auVar47._4_4_ = fVar178 * auVar96._4_4_;
      auVar47._0_4_ = fVar164 * auVar96._0_4_;
      fVar180 = auVar107._8_4_;
      auVar47._8_4_ = fVar180 * auVar96._8_4_;
      fVar182 = auVar107._12_4_;
      auVar47._12_4_ = fVar182 * auVar96._12_4_;
      fVar184 = auVar107._16_4_;
      auVar47._16_4_ = fVar184 * auVar96._16_4_;
      fVar186 = auVar107._20_4_;
      auVar47._20_4_ = fVar186 * auVar96._20_4_;
      fVar187 = auVar107._24_4_;
      auVar47._24_4_ = fVar187 * auVar96._24_4_;
      auVar47._28_4_ = auVar96._28_4_;
      auVar96 = vfmadd213ps_avx512vl(local_840,auVar124,auVar112);
      auVar48._4_4_ = fVar178 * auVar96._4_4_;
      auVar48._0_4_ = fVar164 * auVar96._0_4_;
      auVar48._8_4_ = fVar180 * auVar96._8_4_;
      auVar48._12_4_ = fVar182 * auVar96._12_4_;
      auVar48._16_4_ = fVar184 * auVar96._16_4_;
      auVar48._20_4_ = fVar186 * auVar96._20_4_;
      auVar48._24_4_ = fVar187 * auVar96._24_4_;
      auVar48._28_4_ = auVar134._28_4_;
      auVar96 = vminps_avx512vl(auVar47,auVar130);
      auVar57 = ZEXT812(0);
      auVar110 = ZEXT1232(auVar57) << 0x20;
      auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar57) << 0x20);
      auVar111 = vminps_avx512vl(auVar48,auVar130);
      auVar49._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar96._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar49,auVar238,auVar223);
      auVar96 = vmaxps_avx(auVar111,ZEXT1232(auVar57) << 0x20);
      auVar50._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar96._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar50,auVar238,auVar223);
      auVar51._4_4_ = auVar106._4_4_ * auVar106._4_4_;
      auVar51._0_4_ = auVar106._0_4_ * auVar106._0_4_;
      auVar51._8_4_ = auVar106._8_4_ * auVar106._8_4_;
      auVar51._12_4_ = auVar106._12_4_ * auVar106._12_4_;
      auVar51._16_4_ = auVar106._16_4_ * auVar106._16_4_;
      auVar51._20_4_ = auVar106._20_4_ * auVar106._20_4_;
      auVar51._24_4_ = auVar106._24_4_ * auVar106._24_4_;
      auVar51._28_4_ = auVar106._28_4_;
      auVar96 = vsubps_avx(local_7a0,auVar51);
      auVar52._4_4_ = auVar96._4_4_ * (float)local_580._4_4_;
      auVar52._0_4_ = auVar96._0_4_ * (float)local_580._0_4_;
      auVar52._8_4_ = auVar96._8_4_ * fStack_578;
      auVar52._12_4_ = auVar96._12_4_ * fStack_574;
      auVar52._16_4_ = auVar96._16_4_ * fStack_570;
      auVar52._20_4_ = auVar96._20_4_ * fStack_56c;
      auVar52._24_4_ = auVar96._24_4_ * fStack_568;
      auVar52._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(local_560,auVar52);
      uVar21 = vcmpps_avx512vl(auVar106,ZEXT1232(auVar57) << 0x20,5);
      bVar68 = (byte)uVar21;
      auVar259 = ZEXT3264(local_920);
      if (bVar68 == 0) {
        bVar68 = 0;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar233 = ZEXT864(0) << 0x20;
        auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar251 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar136._8_4_ = 0x7f800000;
        auVar136._0_8_ = 0x7f8000007f800000;
        auVar136._12_4_ = 0x7f800000;
        auVar136._16_4_ = 0x7f800000;
        auVar136._20_4_ = 0x7f800000;
        auVar136._24_4_ = 0x7f800000;
        auVar136._28_4_ = 0x7f800000;
        auVar137._8_4_ = 0xff800000;
        auVar137._0_8_ = 0xff800000ff800000;
        auVar137._12_4_ = 0xff800000;
        auVar137._16_4_ = 0xff800000;
        auVar137._20_4_ = 0xff800000;
        auVar137._24_4_ = 0xff800000;
        auVar137._28_4_ = 0xff800000;
      }
      else {
        auVar85 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
        uVar80 = vcmpps_avx512vl(auVar106,auVar127,5);
        auVar106 = vsqrtps_avx(auVar106);
        auVar110 = vfnmadd213ps_avx512vl(auVar125,local_600,auVar130);
        auVar114 = vfmadd132ps_avx512vl(auVar110,local_600,local_600);
        auVar110 = vsubps_avx(local_5a0,auVar106);
        auVar115 = vmulps_avx512vl(auVar110,auVar114);
        auVar106 = vsubps_avx512vl(auVar106,auVar122);
        auVar114 = vmulps_avx512vl(auVar106,auVar114);
        auVar106 = vfmadd213ps_avx512vl(auVar124,auVar115,auVar112);
        auVar53._4_4_ = fVar178 * auVar106._4_4_;
        auVar53._0_4_ = fVar164 * auVar106._0_4_;
        auVar53._8_4_ = fVar180 * auVar106._8_4_;
        auVar53._12_4_ = fVar182 * auVar106._12_4_;
        auVar53._16_4_ = fVar184 * auVar106._16_4_;
        auVar53._20_4_ = fVar186 * auVar106._20_4_;
        auVar53._24_4_ = fVar187 * auVar106._24_4_;
        auVar53._28_4_ = auVar111._28_4_;
        auVar54._4_4_ = (float)local_520._4_4_ * auVar115._4_4_;
        auVar54._0_4_ = (float)local_520._0_4_ * auVar115._0_4_;
        auVar54._8_4_ = fStack_518 * auVar115._8_4_;
        auVar54._12_4_ = fStack_514 * auVar115._12_4_;
        auVar54._16_4_ = fStack_510 * auVar115._16_4_;
        auVar54._20_4_ = fStack_50c * auVar115._20_4_;
        auVar54._24_4_ = fStack_508 * auVar115._24_4_;
        auVar54._28_4_ = auVar106._28_4_;
        auVar110 = vmulps_avx512vl(local_540,auVar115);
        auVar116 = vmulps_avx512vl(local_620,auVar115);
        auVar106 = vfmadd213ps_avx512vl(auVar97,auVar53,auVar230);
        auVar106 = vsubps_avx512vl(auVar54,auVar106);
        auVar111 = vfmadd213ps_avx512vl(auVar108,auVar53,auVar95);
        auVar111 = vsubps_avx512vl(auVar110,auVar111);
        auVar82 = vfmadd213ps_fma(auVar53,auVar109,auVar113);
        auVar110 = vsubps_avx(auVar116,ZEXT1632(auVar82));
        auVar251 = auVar110._0_28_;
        auVar110 = vfmadd213ps_avx512vl(auVar124,auVar114,auVar112);
        auVar112 = vmulps_avx512vl(auVar107,auVar110);
        auVar255 = ZEXT3264(auVar112);
        auVar55._4_4_ = (float)local_520._4_4_ * auVar114._4_4_;
        auVar55._0_4_ = (float)local_520._0_4_ * auVar114._0_4_;
        auVar55._8_4_ = fStack_518 * auVar114._8_4_;
        auVar55._12_4_ = fStack_514 * auVar114._12_4_;
        auVar55._16_4_ = fStack_510 * auVar114._16_4_;
        auVar55._20_4_ = fStack_50c * auVar114._20_4_;
        auVar55._24_4_ = fStack_508 * auVar114._24_4_;
        auVar55._28_4_ = auVar116._28_4_;
        auVar107 = vmulps_avx512vl(local_540,auVar114);
        auVar116 = vmulps_avx512vl(local_620,auVar114);
        auVar82 = vfmadd213ps_fma(auVar97,auVar112,auVar230);
        auVar110 = vsubps_avx(auVar55,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar108,auVar112,auVar95);
        auVar107 = vsubps_avx512vl(auVar107,ZEXT1632(auVar82));
        auVar82 = vfmadd213ps_fma(auVar109,auVar112,auVar113);
        auVar97 = vsubps_avx512vl(auVar116,ZEXT1632(auVar82));
        auVar233 = ZEXT3264(auVar97);
        auVar203._8_4_ = 0x7f800000;
        auVar203._0_8_ = 0x7f8000007f800000;
        auVar203._12_4_ = 0x7f800000;
        auVar203._16_4_ = 0x7f800000;
        auVar203._20_4_ = 0x7f800000;
        auVar203._24_4_ = 0x7f800000;
        auVar203._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar203,auVar115);
        bVar12 = (bool)((byte)uVar80 & 1);
        auVar136._0_4_ = (uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar83._0_4_;
        bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar83._4_4_;
        bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar83._8_4_;
        bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar83._12_4_;
        iVar1 = (uint)((byte)(uVar80 >> 4) & 1) * auVar97._16_4_;
        auVar136._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar80 >> 5) & 1) * auVar97._20_4_;
        auVar136._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar80 >> 6) & 1) * auVar97._24_4_;
        auVar136._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar80 >> 7) * auVar97._28_4_;
        auVar136._28_4_ = iVar4;
        auVar204._8_4_ = 0xff800000;
        auVar204._0_8_ = 0xff800000ff800000;
        auVar204._12_4_ = 0xff800000;
        auVar204._16_4_ = 0xff800000;
        auVar204._20_4_ = 0xff800000;
        auVar204._24_4_ = 0xff800000;
        auVar204._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar204,auVar114);
        bVar12 = (bool)((byte)uVar80 & 1);
        auVar137._0_4_ = (uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar137._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * -0x800000;
        auVar35._8_4_ = 0x36000000;
        auVar35._0_8_ = 0x3600000036000000;
        auVar35._12_4_ = 0x36000000;
        auVar35._16_4_ = 0x36000000;
        auVar35._20_4_ = 0x36000000;
        auVar35._24_4_ = 0x36000000;
        auVar35._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(local_5c0,auVar35);
        uVar72 = vcmpps_avx512vl(auVar97,local_5e0,0xe);
        uVar80 = uVar80 & uVar72;
        bVar73 = (byte)uVar80;
        if (bVar73 != 0) {
          uVar72 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar85),2);
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar108 = vblendmps_avx512vl(auVar247,auVar250);
          bVar77 = (byte)uVar72;
          uVar70 = (uint)(bVar77 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar97._0_4_;
          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
          uVar143 = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar97._4_4_;
          bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
          uVar144 = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar97._8_4_;
          bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
          uVar145 = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar97._12_4_;
          bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
          uVar146 = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * auVar97._16_4_;
          bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
          uVar147 = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * auVar97._20_4_;
          bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
          uVar148 = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * auVar97._24_4_;
          bVar12 = SUB81(uVar72 >> 7,0);
          uVar149 = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * auVar97._28_4_;
          auVar136._0_4_ = (bVar73 & 1) * uVar70 | !(bool)(bVar73 & 1) * auVar136._0_4_;
          bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar136._4_4_ = bVar12 * uVar143 | !bVar12 * auVar136._4_4_;
          bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar136._8_4_ = bVar12 * uVar144 | !bVar12 * auVar136._8_4_;
          bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar136._12_4_ = bVar12 * uVar145 | !bVar12 * auVar136._12_4_;
          bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar136._16_4_ = bVar12 * uVar146 | (uint)!bVar12 * iVar1;
          bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar136._20_4_ = bVar12 * uVar147 | (uint)!bVar12 * iVar2;
          bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar136._24_4_ = bVar12 * uVar148 | (uint)!bVar12 * iVar3;
          bVar12 = SUB81(uVar80 >> 7,0);
          auVar136._28_4_ = bVar12 * uVar149 | (uint)!bVar12 * iVar4;
          auVar97 = vblendmps_avx512vl(auVar250,auVar247);
          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar137._0_4_ =
               (uint)(bVar73 & 1) *
               ((uint)(bVar77 & 1) * auVar97._0_4_ | !(bool)(bVar77 & 1) * uVar70) |
               !(bool)(bVar73 & 1) * auVar137._0_4_;
          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar137._4_4_ =
               (uint)bVar13 * ((uint)bVar12 * auVar97._4_4_ | !bVar12 * uVar143) |
               !bVar13 * auVar137._4_4_;
          bVar12 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar137._8_4_ =
               (uint)bVar12 * ((uint)bVar14 * auVar97._8_4_ | !bVar14 * uVar144) |
               !bVar12 * auVar137._8_4_;
          bVar12 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar137._12_4_ =
               (uint)bVar12 * ((uint)bVar15 * auVar97._12_4_ | !bVar15 * uVar145) |
               !bVar12 * auVar137._12_4_;
          bVar12 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar137._16_4_ =
               (uint)bVar12 * ((uint)bVar16 * auVar97._16_4_ | !bVar16 * uVar146) |
               !bVar12 * auVar137._16_4_;
          bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar137._20_4_ =
               (uint)bVar12 * ((uint)bVar17 * auVar97._20_4_ | !bVar17 * uVar147) |
               !bVar12 * auVar137._20_4_;
          bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar137._24_4_ =
               (uint)bVar12 * ((uint)bVar18 * auVar97._24_4_ | !bVar18 * uVar148) |
               !bVar12 * auVar137._24_4_;
          bVar12 = SUB81(uVar80 >> 7,0);
          auVar137._28_4_ =
               (uint)bVar12 * ((uint)bVar19 * auVar97._28_4_ | !bVar19 * uVar149) |
               !bVar12 * auVar137._28_4_;
          bVar68 = (~bVar73 | bVar77) & bVar68;
        }
      }
      auVar244._0_4_ = local_620._0_4_ * auVar233._0_4_;
      auVar244._4_4_ = local_620._4_4_ * auVar233._4_4_;
      auVar244._8_4_ = local_620._8_4_ * auVar233._8_4_;
      auVar244._12_4_ = local_620._12_4_ * auVar233._12_4_;
      auVar244._16_4_ = local_620._16_4_ * auVar233._16_4_;
      auVar244._20_4_ = local_620._20_4_ * auVar233._20_4_;
      auVar244._28_36_ = auVar233._28_36_;
      auVar244._24_4_ = local_620._24_4_ * auVar233._24_4_;
      auVar82 = vfmadd231ps_fma(auVar244._0_32_,local_540,auVar107);
      auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),_local_520,auVar110);
      _local_200 = _local_6e0;
      local_1e0 = vminps_avx(local_2e0,auVar136);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(ZEXT1632(auVar82),auVar243);
      auVar97 = vmaxps_avx(_local_6e0,auVar137);
      local_300 = auVar97;
      auVar206._8_4_ = 0x3e99999a;
      auVar206._0_8_ = 0x3e99999a3e99999a;
      auVar206._12_4_ = 0x3e99999a;
      auVar206._16_4_ = 0x3e99999a;
      auVar206._20_4_ = 0x3e99999a;
      auVar206._24_4_ = 0x3e99999a;
      auVar206._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar107,auVar206,1);
      local_500._0_2_ = (short)uVar21;
      uVar21 = vcmpps_avx512vl(_local_6e0,local_1e0,2);
      bVar73 = (byte)uVar21 & bVar66;
      uVar22 = vcmpps_avx512vl(auVar97,local_2e0,2);
      auVar254 = ZEXT3264(local_8a0);
      auVar256 = ZEXT3264(local_8c0);
      auVar257 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      if ((bVar66 & ((byte)uVar22 | (byte)uVar21)) == 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar106);
        auVar244 = ZEXT3264(local_640);
        auVar233 = ZEXT3264(local_800);
      }
      else {
        auVar56._4_4_ = local_620._4_4_ * auVar251._4_4_;
        auVar56._0_4_ = local_620._0_4_ * auVar251._0_4_;
        auVar56._8_4_ = local_620._8_4_ * auVar251._8_4_;
        auVar56._12_4_ = local_620._12_4_ * auVar251._12_4_;
        auVar56._16_4_ = local_620._16_4_ * auVar251._16_4_;
        auVar56._20_4_ = local_620._20_4_ * auVar251._20_4_;
        auVar56._24_4_ = local_620._24_4_ * auVar251._24_4_;
        auVar56._28_4_ = 0x3e99999a;
        auVar82 = vfmadd213ps_fma(auVar111,local_540,auVar56);
        auVar82 = vfmadd213ps_fma(auVar106,_local_520,ZEXT1632(auVar82));
        auVar106 = vandps_avx(ZEXT1632(auVar82),auVar243);
        uVar21 = vcmpps_avx512vl(auVar106,auVar206,1);
        bVar77 = (byte)uVar21 | ~bVar68;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar160,auVar36);
        local_2a0._0_4_ = (uint)(bVar77 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar12 = (bool)(bVar77 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar77 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar77 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar77 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar77 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar77 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * 2;
        local_2a0._28_4_ = (uint)(bVar77 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        local_480 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_480,local_2a0,5);
        bVar77 = (byte)uVar21 & bVar73;
        if (bVar77 == 0) {
          auVar162._4_4_ = uVar81;
          auVar162._0_4_ = uVar81;
          auVar162._8_4_ = uVar81;
          auVar162._12_4_ = uVar81;
          auVar162._16_4_ = uVar81;
          auVar162._20_4_ = uVar81;
          auVar162._24_4_ = uVar81;
          auVar162._28_4_ = uVar81;
        }
        else {
          local_2c0 = auVar97;
          auVar85 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar82 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar5 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar86 = vminps_avx(auVar85,auVar5);
          auVar85 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar5 = vmaxps_avx(auVar82,auVar85);
          auVar94._8_4_ = 0x7fffffff;
          auVar94._0_8_ = 0x7fffffff7fffffff;
          auVar94._12_4_ = 0x7fffffff;
          auVar82 = vandps_avx(auVar86,auVar94);
          auVar85 = vandps_avx(auVar5,auVar94);
          auVar82 = vmaxps_avx(auVar82,auVar85);
          auVar85 = vmovshdup_avx(auVar82);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          fVar150 = auVar82._0_4_ * 1.9073486e-06;
          local_740 = vshufps_avx(auVar5,auVar5,0xff);
          local_4e0 = (float)local_7e0._0_4_ + (float)local_6e0._0_4_;
          fStack_4dc = (float)local_7e0._4_4_ + (float)local_6e0._4_4_;
          fStack_4d8 = fStack_7d8 + fStack_6d8;
          fStack_4d4 = fStack_7d4 + fStack_6d4;
          fStack_4d0 = fStack_7d0 + fStack_6d0;
          fStack_4cc = fStack_7cc + fStack_6cc;
          fStack_4c8 = fStack_7c8 + fStack_6c8;
          fStack_4c4 = fStack_7c4 + fStack_6c4;
          do {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar161,_local_6e0);
            auVar139._0_4_ =
                 (uint)(bVar77 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar12 = (bool)(bVar77 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar77 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar77 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar77 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar77 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 0x7f800000;
            auVar139._24_4_ =
                 (uint)(bVar77 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar106 = vminps_avx(auVar139,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar21 = vcmpps_avx512vl(auVar139,auVar106,0);
            bVar67 = (byte)uVar21 & bVar77;
            bVar69 = bVar77;
            if (bVar67 != 0) {
              bVar69 = bVar67;
            }
            iVar2 = 0;
            for (uVar81 = (uint)bVar69; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar81 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
            fVar177 = auVar20._0_4_;
            auVar82 = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            if ((float)local_820._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              fVar177 = sqrtf((float)local_820._0_4_);
              auVar82 = local_880._0_16_;
            }
            auVar82 = vinsertps_avx(auVar82,ZEXT416(uVar81),0x10);
            lVar76 = 5;
            do {
              uVar165 = auVar82._0_4_;
              auVar152._4_4_ = uVar165;
              auVar152._0_4_ = uVar165;
              auVar152._8_4_ = uVar165;
              auVar152._12_4_ = uVar165;
              auVar5 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_810);
              auVar85 = vmovshdup_avx(auVar82);
              local_5a0._0_16_ = auVar85;
              fVar185 = 1.0 - auVar85._0_4_;
              auVar85 = vshufps_avx(auVar82,auVar82,0x55);
              fVar179 = auVar85._0_4_;
              auVar188._0_4_ = local_6a0._0_4_ * fVar179;
              fVar181 = auVar85._4_4_;
              auVar188._4_4_ = local_6a0._4_4_ * fVar181;
              fVar151 = auVar85._8_4_;
              auVar188._8_4_ = local_6a0._8_4_ * fVar151;
              fVar183 = auVar85._12_4_;
              auVar188._12_4_ = local_6a0._12_4_ * fVar183;
              _local_580 = ZEXT416((uint)fVar185);
              auVar211._4_4_ = fVar185;
              auVar211._0_4_ = fVar185;
              auVar211._8_4_ = fVar185;
              auVar211._12_4_ = fVar185;
              auVar85 = vfmadd231ps_fma(auVar188,auVar211,local_660._0_16_);
              auVar226._0_4_ = local_680._0_4_ * fVar179;
              auVar226._4_4_ = local_680._4_4_ * fVar181;
              auVar226._8_4_ = local_680._8_4_ * fVar151;
              auVar226._12_4_ = local_680._12_4_ * fVar183;
              auVar86 = vfmadd231ps_fma(auVar226,auVar211,local_6a0._0_16_);
              auVar234._0_4_ = fVar179 * (float)local_6c0._0_4_;
              auVar234._4_4_ = fVar181 * (float)local_6c0._4_4_;
              auVar234._8_4_ = fVar151 * fStack_6b8;
              auVar234._12_4_ = fVar183 * fStack_6b4;
              auVar87 = vfmadd231ps_fma(auVar234,auVar211,local_680._0_16_);
              auVar240._0_4_ = fVar179 * auVar86._0_4_;
              auVar240._4_4_ = fVar181 * auVar86._4_4_;
              auVar240._8_4_ = fVar151 * auVar86._8_4_;
              auVar240._12_4_ = fVar183 * auVar86._12_4_;
              auVar85 = vfmadd231ps_fma(auVar240,auVar211,auVar85);
              auVar189._0_4_ = fVar179 * auVar87._0_4_;
              auVar189._4_4_ = fVar181 * auVar87._4_4_;
              auVar189._8_4_ = fVar151 * auVar87._8_4_;
              auVar189._12_4_ = fVar183 * auVar87._12_4_;
              auVar86 = vfmadd231ps_fma(auVar189,auVar211,auVar86);
              auVar227._0_4_ = fVar179 * auVar86._0_4_;
              auVar227._4_4_ = fVar181 * auVar86._4_4_;
              auVar227._8_4_ = fVar151 * auVar86._8_4_;
              auVar227._12_4_ = fVar183 * auVar86._12_4_;
              auVar87 = vfmadd231ps_fma(auVar227,auVar85,auVar211);
              auVar85 = vsubps_avx(auVar86,auVar85);
              auVar24._8_4_ = 0x40400000;
              auVar24._0_8_ = 0x4040000040400000;
              auVar24._12_4_ = 0x40400000;
              auVar86 = vmulps_avx512vl(auVar85,auVar24);
              local_560._0_16_ = auVar87;
              auVar5 = vsubps_avx(auVar5,auVar87);
              auVar85 = vdpps_avx(auVar5,auVar5,0x7f);
              local_880._0_16_ = auVar85;
              local_7a0 = ZEXT1632(auVar82);
              if (auVar85._0_4_ < 0.0) {
                auVar233._0_4_ = sqrtf(auVar85._0_4_);
                auVar233._4_60_ = extraout_var;
                auVar82 = auVar233._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar85,auVar85);
              }
              local_5c0._0_16_ = vdpps_avx(auVar86,auVar86,0x7f);
              fVar179 = local_5c0._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar179;
              local_840._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar181 = local_840._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(local_5c0._0_16_,auVar25);
              auVar85 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar85._0_4_;
              local_7c0._0_4_ = auVar82._0_4_;
              if (fVar179 < auVar87._0_4_) {
                fVar151 = sqrtf(fVar179);
                auVar82 = ZEXT416((uint)local_7c0._0_4_);
              }
              else {
                auVar85 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar151 = auVar85._0_4_;
              }
              fVar183 = local_840._0_4_;
              fVar179 = fVar181 * 1.5 + fVar179 * -0.5 * fVar183 * fVar183 * fVar183;
              auVar153._0_4_ = auVar86._0_4_ * fVar179;
              auVar153._4_4_ = auVar86._4_4_ * fVar179;
              auVar153._8_4_ = auVar86._8_4_ * fVar179;
              auVar153._12_4_ = auVar86._12_4_ * fVar179;
              local_840._0_16_ = vdpps_avx(auVar5,auVar153,0x7f);
              auVar83 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
              auVar154._0_4_ = local_840._0_4_ * local_840._0_4_;
              auVar154._4_4_ = local_840._4_4_ * local_840._4_4_;
              auVar154._8_4_ = local_840._8_4_ * local_840._8_4_;
              auVar154._12_4_ = local_840._12_4_ * local_840._12_4_;
              auVar85 = vsubps_avx(local_880._0_16_,auVar154);
              fVar181 = auVar85._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar181;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
              auVar89 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar79 = fVar181 == 0.0;
              uVar78 = fVar181 < 0.0;
              if ((bool)uVar78) {
                local_700._0_4_ = fVar151;
                local_720._0_4_ = auVar88._0_4_;
                local_730._4_4_ = fVar179;
                local_730._0_4_ = fVar179;
                fStack_728 = fVar179;
                fStack_724 = fVar179;
                local_710 = auVar87;
                fVar181 = sqrtf(fVar181);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar88 = ZEXT416((uint)local_720._0_4_);
                auVar82 = ZEXT416((uint)local_7c0._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar87 = local_710;
                fVar179 = (float)local_730._0_4_;
                fVar183 = (float)local_730._4_4_;
                fVar185 = fStack_728;
                fVar209 = fStack_724;
                fVar151 = (float)local_700._0_4_;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar181 = auVar85._0_4_;
                fVar183 = fVar179;
                fVar185 = fVar179;
                fVar209 = fVar179;
              }
              auVar254 = ZEXT3264(local_8a0);
              auVar256 = ZEXT3264(local_8c0);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_900);
              auVar259 = ZEXT3264(local_920);
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar164 = auVar85._0_4_ * 6.0;
              fVar178 = local_5a0._0_4_ * 6.0;
              auVar212._0_4_ = fVar178 * (float)local_6c0._0_4_;
              auVar212._4_4_ = fVar178 * (float)local_6c0._4_4_;
              auVar212._8_4_ = fVar178 * fStack_6b8;
              auVar212._12_4_ = fVar178 * fStack_6b4;
              auVar191._4_4_ = fVar164;
              auVar191._0_4_ = fVar164;
              auVar191._8_4_ = fVar164;
              auVar191._12_4_ = fVar164;
              auVar85 = vfmadd132ps_fma(auVar191,auVar212,local_680._0_16_);
              fVar164 = auVar91._0_4_ * 6.0;
              auVar168._4_4_ = fVar164;
              auVar168._0_4_ = fVar164;
              auVar168._8_4_ = fVar164;
              auVar168._12_4_ = fVar164;
              auVar85 = vfmadd132ps_fma(auVar168,auVar85,local_6a0._0_16_);
              fVar164 = local_580._0_4_ * 6.0;
              auVar192._4_4_ = fVar164;
              auVar192._0_4_ = fVar164;
              auVar192._8_4_ = fVar164;
              auVar192._12_4_ = fVar164;
              auVar85 = vfmadd132ps_fma(auVar192,auVar85,local_660._0_16_);
              auVar169._0_4_ = auVar85._0_4_ * (float)local_5c0._0_4_;
              auVar169._4_4_ = auVar85._4_4_ * (float)local_5c0._0_4_;
              auVar169._8_4_ = auVar85._8_4_ * (float)local_5c0._0_4_;
              auVar169._12_4_ = auVar85._12_4_ * (float)local_5c0._0_4_;
              auVar85 = vdpps_avx(auVar86,auVar85,0x7f);
              fVar164 = auVar85._0_4_;
              auVar193._0_4_ = auVar86._0_4_ * fVar164;
              auVar193._4_4_ = auVar86._4_4_ * fVar164;
              auVar193._8_4_ = auVar86._8_4_ * fVar164;
              auVar193._12_4_ = auVar86._12_4_ * fVar164;
              auVar85 = vsubps_avx(auVar169,auVar193);
              fVar164 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar91 = vmaxss_avx(ZEXT416((uint)fVar150),
                                   ZEXT416((uint)(local_7a0._0_4_ * fVar177 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar86,auVar26);
              auVar194._0_4_ = fVar179 * auVar85._0_4_ * fVar164;
              auVar194._4_4_ = fVar183 * auVar85._4_4_ * fVar164;
              auVar194._8_4_ = fVar185 * auVar85._8_4_ * fVar164;
              auVar194._12_4_ = fVar209 * auVar85._12_4_ * fVar164;
              auVar255 = ZEXT1664(auVar153);
              auVar85 = vdpps_avx(auVar90,auVar153,0x7f);
              auVar92 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar150),auVar91);
              auVar82 = vdpps_avx(auVar5,auVar194,0x7f);
              vfmadd213ss_avx512f(auVar83,ZEXT416((uint)(fVar150 / fVar151)),auVar92);
              fVar179 = auVar85._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_810,auVar153,0x7f);
              auVar85 = vdpps_avx(auVar5,auVar90,0x7f);
              auVar83 = vmulss_avx512f(auVar89,auVar87);
              auVar87 = vmulss_avx512f(auVar87,auVar87);
              auVar88 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar83._0_4_ * auVar87._0_4_)));
              auVar87 = vdpps_avx(auVar5,local_810,0x7f);
              auVar89 = vfnmadd231ss_avx512f(auVar85,local_840._0_16_,ZEXT416((uint)fVar179));
              auVar87 = vfnmadd231ss_avx512f(auVar87,local_840._0_16_,auVar82);
              auVar85 = vpermilps_avx(local_560._0_16_,0xff);
              fVar181 = fVar181 - auVar85._0_4_;
              auVar83 = vshufps_avx(auVar86,auVar86,0xff);
              auVar85 = vfmsub213ss_fma(auVar89,auVar88,auVar83);
              auVar245._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar179),auVar87);
              auVar85 = vinsertps_avx(auVar245,auVar87,0x1c);
              auVar235._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar179),auVar235,0x10);
              auVar213._0_4_ = auVar88._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar82 = vdivps_avx(auVar85,auVar213);
              auVar85 = vdivps_avx(auVar87,auVar213);
              auVar87 = vbroadcastss_avx512vl(local_840._0_16_);
              auVar214._0_4_ = auVar87._0_4_ * auVar82._0_4_ + fVar181 * auVar85._0_4_;
              auVar214._4_4_ = auVar87._4_4_ * auVar82._4_4_ + fVar181 * auVar85._4_4_;
              auVar214._8_4_ = auVar87._8_4_ * auVar82._8_4_ + fVar181 * auVar85._8_4_;
              auVar214._12_4_ = auVar87._12_4_ * auVar82._12_4_ + fVar181 * auVar85._12_4_;
              auVar82 = vsubps_avx(local_7a0._0_16_,auVar214);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(local_840._0_16_,auVar27);
              auVar85 = vucomiss_avx512f(auVar85);
              if (!(bool)uVar78 && !(bool)uVar79) {
                auVar85 = vaddss_avx512f(auVar91,auVar85);
                auVar85 = vfmadd231ss_fma(auVar85,local_740,ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar87 = vandps_avx512vl(ZEXT416((uint)fVar181),auVar28);
                if (auVar87._0_4_ < auVar85._0_4_) {
                  fVar177 = auVar82._0_4_ + (float)local_750._0_4_;
                  if ((fVar177 < fVar210) ||
                     (fVar179 = *(float *)(ray + k * 4 + 0x100), fVar179 < fVar177)) break;
                  auVar85 = vmovshdup_avx(auVar82);
                  fVar181 = auVar85._0_4_;
                  if ((fVar181 < 0.0) || (1.0 < fVar181)) break;
                  auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_880._0_4_));
                  fVar151 = auVar85._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar75].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar151 = fVar151 * 1.5 +
                            (float)local_880._0_4_ * -0.5 * fVar151 * fVar151 * fVar151;
                  auVar215._0_4_ = auVar5._0_4_ * fVar151;
                  auVar215._4_4_ = auVar5._4_4_ * fVar151;
                  auVar215._8_4_ = auVar5._8_4_ * fVar151;
                  auVar215._12_4_ = auVar5._12_4_ * fVar151;
                  auVar87 = vfmadd213ps_fma(auVar83,auVar215,auVar86);
                  auVar85 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar5 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar216._0_4_ = auVar215._0_4_ * auVar5._0_4_;
                  auVar216._4_4_ = auVar215._4_4_ * auVar5._4_4_;
                  auVar216._8_4_ = auVar215._8_4_ * auVar5._8_4_;
                  auVar216._12_4_ = auVar215._12_4_ * auVar5._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar216,auVar86,auVar85);
                  auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar5 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar155._0_4_ = auVar87._0_4_ * auVar86._0_4_;
                  auVar155._4_4_ = auVar87._4_4_ * auVar86._4_4_;
                  auVar155._8_4_ = auVar87._8_4_ * auVar86._8_4_;
                  auVar155._12_4_ = auVar87._12_4_ * auVar86._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar155,auVar85,auVar5);
                  uVar165 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar177;
                    uVar8 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar165;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar181;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar75;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar224._8_4_ = 1;
                  auVar224._0_8_ = 0x100000001;
                  auVar224._12_4_ = 1;
                  auVar224._16_4_ = 1;
                  auVar224._20_4_ = 1;
                  auVar224._24_4_ = 1;
                  auVar224._28_4_ = 1;
                  local_3c0 = vpermps_avx2(auVar224,ZEXT1632(auVar82));
                  auVar106 = vpermps_avx2(auVar224,ZEXT1632(auVar85));
                  auVar231._8_4_ = 2;
                  auVar231._0_8_ = 0x200000002;
                  auVar231._12_4_ = 2;
                  auVar231._16_4_ = 2;
                  auVar231._20_4_ = 2;
                  auVar231._24_4_ = 2;
                  auVar231._28_4_ = 2;
                  local_400 = vpermps_avx2(auVar231,ZEXT1632(auVar85));
                  local_420[0] = (RTCHitN)auVar106[0];
                  local_420[1] = (RTCHitN)auVar106[1];
                  local_420[2] = (RTCHitN)auVar106[2];
                  local_420[3] = (RTCHitN)auVar106[3];
                  local_420[4] = (RTCHitN)auVar106[4];
                  local_420[5] = (RTCHitN)auVar106[5];
                  local_420[6] = (RTCHitN)auVar106[6];
                  local_420[7] = (RTCHitN)auVar106[7];
                  local_420[8] = (RTCHitN)auVar106[8];
                  local_420[9] = (RTCHitN)auVar106[9];
                  local_420[10] = (RTCHitN)auVar106[10];
                  local_420[0xb] = (RTCHitN)auVar106[0xb];
                  local_420[0xc] = (RTCHitN)auVar106[0xc];
                  local_420[0xd] = (RTCHitN)auVar106[0xd];
                  local_420[0xe] = (RTCHitN)auVar106[0xe];
                  local_420[0xf] = (RTCHitN)auVar106[0xf];
                  local_420[0x10] = (RTCHitN)auVar106[0x10];
                  local_420[0x11] = (RTCHitN)auVar106[0x11];
                  local_420[0x12] = (RTCHitN)auVar106[0x12];
                  local_420[0x13] = (RTCHitN)auVar106[0x13];
                  local_420[0x14] = (RTCHitN)auVar106[0x14];
                  local_420[0x15] = (RTCHitN)auVar106[0x15];
                  local_420[0x16] = (RTCHitN)auVar106[0x16];
                  local_420[0x17] = (RTCHitN)auVar106[0x17];
                  local_420[0x18] = (RTCHitN)auVar106[0x18];
                  local_420[0x19] = (RTCHitN)auVar106[0x19];
                  local_420[0x1a] = (RTCHitN)auVar106[0x1a];
                  local_420[0x1b] = (RTCHitN)auVar106[0x1b];
                  local_420[0x1c] = (RTCHitN)auVar106[0x1c];
                  local_420[0x1d] = (RTCHitN)auVar106[0x1d];
                  local_420[0x1e] = (RTCHitN)auVar106[0x1e];
                  local_420[0x1f] = (RTCHitN)auVar106[0x1f];
                  local_3e0 = uVar165;
                  uStack_3dc = uVar165;
                  uStack_3d8 = uVar165;
                  uStack_3d4 = uVar165;
                  uStack_3d0 = uVar165;
                  uStack_3cc = uVar165;
                  uStack_3c8 = uVar165;
                  uStack_3c4 = uVar165;
                  local_3a0 = ZEXT432(0) << 0x20;
                  local_380 = local_460._0_8_;
                  uStack_378 = local_460._8_8_;
                  uStack_370 = local_460._16_8_;
                  uStack_368 = local_460._24_8_;
                  local_360 = local_440;
                  auVar106 = vpcmpeqd_avx2(local_440,local_440);
                  local_848[1] = auVar106;
                  *local_848 = auVar106;
                  local_340 = pRVar10->instID[0];
                  uStack_33c = local_340;
                  uStack_338 = local_340;
                  uStack_334 = local_340;
                  uStack_330 = local_340;
                  uStack_32c = local_340;
                  uStack_328 = local_340;
                  uStack_324 = local_340;
                  local_320 = pRVar10->instPrimID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  *(float *)(ray + k * 4 + 0x100) = fVar177;
                  local_780 = local_4a0;
                  local_950.valid = (int *)local_780;
                  local_950.geometryUserPtr = pGVar9->userPtr;
                  local_950.context = context->user;
                  local_950.hit = local_420;
                  local_950.N = 8;
                  local_950.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar255 = ZEXT1664(auVar153);
                    (*pGVar9->intersectionFilterN)(&local_950);
                    auVar259 = ZEXT3264(local_920);
                    auVar258 = ZEXT3264(local_900);
                    auVar257 = ZEXT3264(local_8e0);
                    auVar256 = ZEXT3264(local_8c0);
                    auVar254 = ZEXT3264(local_8a0);
                  }
                  if (local_780 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      (*p_Var11)(&local_950);
                      auVar259 = ZEXT3264(local_920);
                      auVar258 = ZEXT3264(local_900);
                      auVar257 = ZEXT3264(local_8e0);
                      auVar256 = ZEXT3264(local_8c0);
                      auVar254 = ZEXT3264(local_8a0);
                    }
                    if (local_780 != (undefined1  [32])0x0) {
                      uVar80 = vptestmd_avx512vl(local_780,local_780);
                      iVar3 = *(int *)(local_950.hit + 4);
                      iVar4 = *(int *)(local_950.hit + 8);
                      iVar1 = *(int *)(local_950.hit + 0xc);
                      iVar58 = *(int *)(local_950.hit + 0x10);
                      iVar59 = *(int *)(local_950.hit + 0x14);
                      iVar60 = *(int *)(local_950.hit + 0x18);
                      iVar61 = *(int *)(local_950.hit + 0x1c);
                      bVar69 = (byte)uVar80;
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x180) =
                           (uint)(bVar69 & 1) * *(int *)local_950.hit |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_950.ray + 0x180);
                      *(uint *)(local_950.ray + 0x184) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x184);
                      *(uint *)(local_950.ray + 0x188) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x188);
                      *(uint *)(local_950.ray + 0x18c) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x18c);
                      *(uint *)(local_950.ray + 400) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 400);
                      *(uint *)(local_950.ray + 0x194) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x194);
                      *(uint *)(local_950.ray + 0x198) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x198);
                      *(uint *)(local_950.ray + 0x19c) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x19c);
                      iVar3 = *(int *)(local_950.hit + 0x24);
                      iVar4 = *(int *)(local_950.hit + 0x28);
                      iVar1 = *(int *)(local_950.hit + 0x2c);
                      iVar58 = *(int *)(local_950.hit + 0x30);
                      iVar59 = *(int *)(local_950.hit + 0x34);
                      iVar60 = *(int *)(local_950.hit + 0x38);
                      iVar61 = *(int *)(local_950.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1a0) =
                           (uint)(bVar69 & 1) * *(int *)(local_950.hit + 0x20) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_950.ray + 0x1a0);
                      *(uint *)(local_950.ray + 0x1a4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1a4);
                      *(uint *)(local_950.ray + 0x1a8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1a8);
                      *(uint *)(local_950.ray + 0x1ac) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1ac);
                      *(uint *)(local_950.ray + 0x1b0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1b0);
                      *(uint *)(local_950.ray + 0x1b4) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1b4);
                      *(uint *)(local_950.ray + 0x1b8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1b8);
                      *(uint *)(local_950.ray + 0x1bc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1bc);
                      iVar3 = *(int *)(local_950.hit + 0x44);
                      iVar4 = *(int *)(local_950.hit + 0x48);
                      iVar1 = *(int *)(local_950.hit + 0x4c);
                      iVar58 = *(int *)(local_950.hit + 0x50);
                      iVar59 = *(int *)(local_950.hit + 0x54);
                      iVar60 = *(int *)(local_950.hit + 0x58);
                      iVar61 = *(int *)(local_950.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1c0) =
                           (uint)(bVar69 & 1) * *(int *)(local_950.hit + 0x40) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_950.ray + 0x1c0);
                      *(uint *)(local_950.ray + 0x1c4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1c4);
                      *(uint *)(local_950.ray + 0x1c8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1c8);
                      *(uint *)(local_950.ray + 0x1cc) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1cc);
                      *(uint *)(local_950.ray + 0x1d0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1d0);
                      *(uint *)(local_950.ray + 0x1d4) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1d4);
                      *(uint *)(local_950.ray + 0x1d8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1d8);
                      *(uint *)(local_950.ray + 0x1dc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1dc);
                      iVar3 = *(int *)(local_950.hit + 100);
                      iVar4 = *(int *)(local_950.hit + 0x68);
                      iVar1 = *(int *)(local_950.hit + 0x6c);
                      iVar58 = *(int *)(local_950.hit + 0x70);
                      iVar59 = *(int *)(local_950.hit + 0x74);
                      iVar60 = *(int *)(local_950.hit + 0x78);
                      iVar61 = *(int *)(local_950.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1e0) =
                           (uint)(bVar69 & 1) * *(int *)(local_950.hit + 0x60) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_950.ray + 0x1e0);
                      *(uint *)(local_950.ray + 0x1e4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1e4);
                      *(uint *)(local_950.ray + 0x1e8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1e8);
                      *(uint *)(local_950.ray + 0x1ec) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1ec);
                      *(uint *)(local_950.ray + 0x1f0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1f0);
                      *(uint *)(local_950.ray + 500) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 500);
                      *(uint *)(local_950.ray + 0x1f8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1f8);
                      *(uint *)(local_950.ray + 0x1fc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1fc);
                      iVar3 = *(int *)(local_950.hit + 0x84);
                      iVar4 = *(int *)(local_950.hit + 0x88);
                      iVar1 = *(int *)(local_950.hit + 0x8c);
                      iVar58 = *(int *)(local_950.hit + 0x90);
                      iVar59 = *(int *)(local_950.hit + 0x94);
                      iVar60 = *(int *)(local_950.hit + 0x98);
                      iVar61 = *(int *)(local_950.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x200) =
                           (uint)(bVar69 & 1) * *(int *)(local_950.hit + 0x80) |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_950.ray + 0x200);
                      *(uint *)(local_950.ray + 0x204) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x204);
                      *(uint *)(local_950.ray + 0x208) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x208);
                      *(uint *)(local_950.ray + 0x20c) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x20c);
                      *(uint *)(local_950.ray + 0x210) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x210);
                      *(uint *)(local_950.ray + 0x214) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x214);
                      *(uint *)(local_950.ray + 0x218) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x218);
                      *(uint *)(local_950.ray + 0x21c) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x21c);
                      auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                      *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar106;
                      auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                      *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar106;
                      auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                      *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar106;
                      auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100));
                      *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar106;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar179;
                  break;
                }
              }
              lVar76 = lVar76 + -1;
            } while (lVar76 != 0);
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar162._4_4_ = uVar165;
            auVar162._0_4_ = uVar165;
            auVar162._8_4_ = uVar165;
            auVar162._12_4_ = uVar165;
            auVar162._16_4_ = uVar165;
            auVar162._20_4_ = uVar165;
            auVar162._24_4_ = uVar165;
            auVar162._28_4_ = uVar165;
            auVar62._4_4_ = fStack_4dc;
            auVar62._0_4_ = local_4e0;
            auVar62._8_4_ = fStack_4d8;
            auVar62._12_4_ = fStack_4d4;
            auVar62._16_4_ = fStack_4d0;
            auVar62._20_4_ = fStack_4cc;
            auVar62._24_4_ = fStack_4c8;
            auVar62._28_4_ = fStack_4c4;
            uVar21 = vcmpps_avx512vl(auVar162,auVar62,0xd);
            bVar77 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar77 & (byte)uVar21;
          } while (bVar77 != 0);
          auVar97 = local_2c0;
        }
        bVar68 = local_500[0] | ~bVar68;
        auVar175._0_4_ = (float)local_7e0._0_4_ + auVar97._0_4_;
        auVar175._4_4_ = (float)local_7e0._4_4_ + auVar97._4_4_;
        auVar175._8_4_ = fStack_7d8 + auVar97._8_4_;
        auVar175._12_4_ = fStack_7d4 + auVar97._12_4_;
        auVar175._16_4_ = fStack_7d0 + auVar97._16_4_;
        auVar175._20_4_ = fStack_7cc + auVar97._20_4_;
        auVar175._24_4_ = fStack_7c8 + auVar97._24_4_;
        auVar175._28_4_ = fStack_7c4 + auVar97._28_4_;
        uVar21 = vcmpps_avx512vl(auVar175,auVar162,2);
        bVar66 = (byte)uVar22 & bVar66 & (byte)uVar21;
        auVar176._8_4_ = 2;
        auVar176._0_8_ = 0x200000002;
        auVar176._12_4_ = 2;
        auVar176._16_4_ = 2;
        auVar176._20_4_ = 2;
        auVar176._24_4_ = 2;
        auVar176._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar176,auVar37);
        auVar140._0_4_ = (uint)(bVar68 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar12 = (bool)(bVar68 >> 1 & 1);
        auVar140._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar68 >> 2 & 1);
        auVar140._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar68 >> 3 & 1);
        auVar140._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar68 >> 4 & 1);
        auVar140._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar68 >> 5 & 1);
        auVar140._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar68 >> 6 & 1);
        auVar140._24_4_ = (uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * 2;
        auVar140._28_4_ = (uint)(bVar68 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2;
        uVar21 = vpcmpd_avx512vl(local_480,auVar140,5);
        bVar68 = (byte)uVar21 & bVar66;
        fVar150 = (float)local_7e0._0_4_;
        fVar177 = (float)local_7e0._4_4_;
        fVar179 = fStack_7d8;
        fVar181 = fStack_7d4;
        fVar151 = fStack_7d0;
        fVar183 = fStack_7cc;
        fVar185 = fStack_7c8;
        fVar209 = fStack_7c4;
        if (bVar68 != 0) {
          auVar85 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar82 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar5 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar86 = vminps_avx(auVar85,auVar5);
          auVar85 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar5 = vmaxps_avx(auVar82,auVar85);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar82 = vandps_avx(auVar86,auVar195);
          auVar85 = vandps_avx(auVar5,auVar195);
          auVar82 = vmaxps_avx(auVar82,auVar85);
          auVar85 = vmovshdup_avx(auVar82);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          auVar82 = vshufpd_avx(auVar82,auVar82,1);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          fVar150 = auVar82._0_4_ * 1.9073486e-06;
          local_740 = vshufps_avx(auVar5,auVar5,0xff);
          local_4e0 = (float)local_7e0._0_4_ + local_300._0_4_;
          fStack_4dc = (float)local_7e0._4_4_ + local_300._4_4_;
          fStack_4d8 = fStack_7d8 + local_300._8_4_;
          fStack_4d4 = fStack_7d4 + local_300._12_4_;
          fStack_4d0 = fStack_7d0 + local_300._16_4_;
          fStack_4cc = fStack_7cc + local_300._20_4_;
          fStack_4c8 = fStack_7c8 + local_300._24_4_;
          fStack_4c4 = fStack_7c4 + local_300._28_4_;
          _local_6e0 = local_300;
          local_500 = auVar140;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar163,_local_6e0);
            auVar141._0_4_ =
                 (uint)(bVar68 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
            bVar12 = (bool)(bVar68 >> 1 & 1);
            auVar141._4_4_ = (uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar68 >> 2 & 1);
            auVar141._8_4_ = (uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar68 >> 3 & 1);
            auVar141._12_4_ = (uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar68 >> 4 & 1);
            auVar141._16_4_ = (uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar68 >> 5 & 1);
            auVar141._20_4_ = (uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * 0x7f800000;
            auVar141._24_4_ =
                 (uint)(bVar68 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar141,auVar141,0xb1);
            auVar106 = vminps_avx(auVar141,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar21 = vcmpps_avx512vl(auVar141,auVar106,0);
            bVar69 = (byte)uVar21 & bVar68;
            bVar77 = bVar68;
            if (bVar69 != 0) {
              bVar77 = bVar69;
            }
            iVar2 = 0;
            for (uVar81 = (uint)bVar77; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar81 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
            fVar177 = auVar84._0_4_;
            auVar82 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar2 << 2)));
            if ((float)local_820._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar2 << 2)));
              fVar177 = sqrtf((float)local_820._0_4_);
              auVar82 = local_880._0_16_;
            }
            auVar82 = vinsertps_avx(auVar82,ZEXT416(uVar81),0x10);
            lVar76 = 5;
            do {
              uVar165 = auVar82._0_4_;
              auVar156._4_4_ = uVar165;
              auVar156._0_4_ = uVar165;
              auVar156._8_4_ = uVar165;
              auVar156._12_4_ = uVar165;
              auVar5 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_810);
              auVar85 = vmovshdup_avx(auVar82);
              local_5a0._0_16_ = auVar85;
              fVar185 = 1.0 - auVar85._0_4_;
              auVar85 = vshufps_avx(auVar82,auVar82,0x55);
              fVar179 = auVar85._0_4_;
              auVar196._0_4_ = local_6a0._0_4_ * fVar179;
              fVar181 = auVar85._4_4_;
              auVar196._4_4_ = local_6a0._4_4_ * fVar181;
              fVar151 = auVar85._8_4_;
              auVar196._8_4_ = local_6a0._8_4_ * fVar151;
              fVar183 = auVar85._12_4_;
              auVar196._12_4_ = local_6a0._12_4_ * fVar183;
              _local_580 = ZEXT416((uint)fVar185);
              auVar217._4_4_ = fVar185;
              auVar217._0_4_ = fVar185;
              auVar217._8_4_ = fVar185;
              auVar217._12_4_ = fVar185;
              auVar85 = vfmadd231ps_fma(auVar196,auVar217,local_660._0_16_);
              auVar228._0_4_ = local_680._0_4_ * fVar179;
              auVar228._4_4_ = local_680._4_4_ * fVar181;
              auVar228._8_4_ = local_680._8_4_ * fVar151;
              auVar228._12_4_ = local_680._12_4_ * fVar183;
              auVar86 = vfmadd231ps_fma(auVar228,auVar217,local_6a0._0_16_);
              auVar236._0_4_ = fVar179 * (float)local_6c0._0_4_;
              auVar236._4_4_ = fVar181 * (float)local_6c0._4_4_;
              auVar236._8_4_ = fVar151 * fStack_6b8;
              auVar236._12_4_ = fVar183 * fStack_6b4;
              auVar87 = vfmadd231ps_fma(auVar236,auVar217,local_680._0_16_);
              auVar241._0_4_ = fVar179 * auVar86._0_4_;
              auVar241._4_4_ = fVar181 * auVar86._4_4_;
              auVar241._8_4_ = fVar151 * auVar86._8_4_;
              auVar241._12_4_ = fVar183 * auVar86._12_4_;
              auVar85 = vfmadd231ps_fma(auVar241,auVar217,auVar85);
              auVar197._0_4_ = fVar179 * auVar87._0_4_;
              auVar197._4_4_ = fVar181 * auVar87._4_4_;
              auVar197._8_4_ = fVar151 * auVar87._8_4_;
              auVar197._12_4_ = fVar183 * auVar87._12_4_;
              auVar86 = vfmadd231ps_fma(auVar197,auVar217,auVar86);
              auVar229._0_4_ = fVar179 * auVar86._0_4_;
              auVar229._4_4_ = fVar181 * auVar86._4_4_;
              auVar229._8_4_ = fVar151 * auVar86._8_4_;
              auVar229._12_4_ = fVar183 * auVar86._12_4_;
              auVar87 = vfmadd231ps_fma(auVar229,auVar85,auVar217);
              auVar85 = vsubps_avx(auVar86,auVar85);
              auVar29._8_4_ = 0x40400000;
              auVar29._0_8_ = 0x4040000040400000;
              auVar29._12_4_ = 0x40400000;
              auVar86 = vmulps_avx512vl(auVar85,auVar29);
              local_560._0_16_ = auVar87;
              auVar5 = vsubps_avx(auVar5,auVar87);
              auVar85 = vdpps_avx(auVar5,auVar5,0x7f);
              local_880._0_16_ = auVar85;
              local_7a0 = ZEXT1632(auVar82);
              if (auVar85._0_4_ < 0.0) {
                auVar254._0_4_ = sqrtf(auVar85._0_4_);
                auVar254._4_60_ = extraout_var_00;
                auVar82 = auVar254._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar85,auVar85);
              }
              local_5c0._0_16_ = vdpps_avx(auVar86,auVar86,0x7f);
              fVar179 = local_5c0._0_4_;
              auVar198._4_12_ = ZEXT812(0) << 0x20;
              auVar198._0_4_ = fVar179;
              local_840._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
              fVar181 = local_840._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(local_5c0._0_16_,auVar30);
              auVar85 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar85._0_4_;
              local_7c0._0_4_ = auVar82._0_4_;
              if (fVar179 < auVar87._0_4_) {
                fVar151 = sqrtf(fVar179);
                auVar82 = ZEXT416((uint)local_7c0._0_4_);
              }
              else {
                auVar85 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar151 = auVar85._0_4_;
              }
              fVar183 = local_840._0_4_;
              auVar83 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar181 * 1.5 +
                                                 fVar179 * -0.5 * fVar183 * fVar183 * fVar183)));
              auVar87 = vmulps_avx512vl(auVar86,auVar83);
              local_840._0_16_ = vdpps_avx(auVar5,auVar87,0x7f);
              auVar89 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
              auVar157._0_4_ = local_840._0_4_ * local_840._0_4_;
              auVar157._4_4_ = local_840._4_4_ * local_840._4_4_;
              auVar157._8_4_ = local_840._8_4_ * local_840._8_4_;
              auVar157._12_4_ = local_840._12_4_ * local_840._12_4_;
              auVar85 = vsubps_avx(local_880._0_16_,auVar157);
              fVar179 = auVar85._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar179;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar91 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              auVar92 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar79 = fVar179 == 0.0;
              uVar78 = fVar179 < 0.0;
              if ((bool)uVar78) {
                local_710._0_4_ = auVar91._0_4_;
                _local_730 = auVar83;
                local_720 = auVar87;
                local_700 = auVar88;
                fVar179 = sqrtf(fVar179);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar91 = ZEXT416((uint)local_710._0_4_);
                auVar82 = ZEXT416((uint)local_7c0._0_4_);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar87 = local_720;
                auVar88 = local_700;
                auVar83 = _local_730;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar179 = auVar85._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar83);
              auVar255 = ZEXT1664(auVar87);
              auVar254 = ZEXT3264(local_8a0);
              auVar256 = ZEXT3264(local_8c0);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_900);
              auVar259 = ZEXT3264(local_920);
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar181 = auVar85._0_4_ * 6.0;
              fVar183 = local_5a0._0_4_ * 6.0;
              auVar218._0_4_ = fVar183 * (float)local_6c0._0_4_;
              auVar218._4_4_ = fVar183 * (float)local_6c0._4_4_;
              auVar218._8_4_ = fVar183 * fStack_6b8;
              auVar218._12_4_ = fVar183 * fStack_6b4;
              auVar199._4_4_ = fVar181;
              auVar199._0_4_ = fVar181;
              auVar199._8_4_ = fVar181;
              auVar199._12_4_ = fVar181;
              auVar85 = vfmadd132ps_fma(auVar199,auVar218,local_680._0_16_);
              fVar181 = auVar90._0_4_ * 6.0;
              auVar171._4_4_ = fVar181;
              auVar171._0_4_ = fVar181;
              auVar171._8_4_ = fVar181;
              auVar171._12_4_ = fVar181;
              auVar85 = vfmadd132ps_fma(auVar171,auVar85,local_6a0._0_16_);
              fVar181 = local_580._0_4_ * 6.0;
              auVar200._4_4_ = fVar181;
              auVar200._0_4_ = fVar181;
              auVar200._8_4_ = fVar181;
              auVar200._12_4_ = fVar181;
              auVar85 = vfmadd132ps_fma(auVar200,auVar85,local_660._0_16_);
              auVar172._0_4_ = auVar85._0_4_ * (float)local_5c0._0_4_;
              auVar172._4_4_ = auVar85._4_4_ * (float)local_5c0._0_4_;
              auVar172._8_4_ = auVar85._8_4_ * (float)local_5c0._0_4_;
              auVar172._12_4_ = auVar85._12_4_ * (float)local_5c0._0_4_;
              auVar85 = vdpps_avx(auVar86,auVar85,0x7f);
              fVar181 = auVar85._0_4_;
              auVar201._0_4_ = auVar86._0_4_ * fVar181;
              auVar201._4_4_ = auVar86._4_4_ * fVar181;
              auVar201._8_4_ = auVar86._8_4_ * fVar181;
              auVar201._12_4_ = auVar86._12_4_ * fVar181;
              auVar85 = vsubps_avx(auVar172,auVar201);
              fVar181 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar90 = vmaxss_avx(ZEXT416((uint)fVar150),
                                   ZEXT416((uint)(local_7a0._0_4_ * fVar177 * 1.9073486e-06)));
              auVar202._0_4_ = auVar85._0_4_ * fVar181;
              auVar202._4_4_ = auVar85._4_4_ * fVar181;
              auVar202._8_4_ = auVar85._8_4_ * fVar181;
              auVar202._12_4_ = auVar85._12_4_ * fVar181;
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(auVar86,auVar31);
              auVar94 = vmulps_avx512vl(auVar83,auVar202);
              auVar85 = vdpps_avx(auVar93,auVar87,0x7f);
              auVar83 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar150),auVar90);
              auVar82 = vdpps_avx(auVar5,auVar94,0x7f);
              vfmadd213ss_avx512f(auVar89,ZEXT416((uint)(fVar150 / fVar151)),auVar83);
              fVar181 = auVar85._0_4_ + auVar82._0_4_;
              auVar82 = vdpps_avx(local_810,auVar87,0x7f);
              auVar85 = vdpps_avx(auVar5,auVar93,0x7f);
              auVar83 = vmulss_avx512f(auVar92,auVar88);
              auVar88 = vmulss_avx512f(auVar88,auVar88);
              auVar89 = vaddss_avx512f(auVar91,ZEXT416((uint)(auVar83._0_4_ * auVar88._0_4_)));
              auVar83 = vdpps_avx(auVar5,local_810,0x7f);
              auVar91 = vfnmadd231ss_avx512f(auVar85,local_840._0_16_,ZEXT416((uint)fVar181));
              auVar83 = vfnmadd231ss_avx512f(auVar83,local_840._0_16_,auVar82);
              auVar85 = vpermilps_avx(local_560._0_16_,0xff);
              fVar179 = fVar179 - auVar85._0_4_;
              auVar88 = vshufps_avx(auVar86,auVar86,0xff);
              auVar85 = vfmsub213ss_fma(auVar91,auVar89,auVar88);
              auVar246._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar83 = ZEXT416((uint)(auVar83._0_4_ * auVar89._0_4_));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar181),auVar83);
              auVar85 = vinsertps_avx(auVar246,auVar83,0x1c);
              auVar237._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = auVar82._8_4_ ^ 0x80000000;
              auVar237._12_4_ = auVar82._12_4_ ^ 0x80000000;
              auVar83 = vinsertps_avx(ZEXT416((uint)fVar181),auVar237,0x10);
              auVar219._0_4_ = auVar89._0_4_;
              auVar219._4_4_ = auVar219._0_4_;
              auVar219._8_4_ = auVar219._0_4_;
              auVar219._12_4_ = auVar219._0_4_;
              auVar82 = vdivps_avx(auVar85,auVar219);
              auVar85 = vdivps_avx(auVar83,auVar219);
              auVar83 = vbroadcastss_avx512vl(local_840._0_16_);
              auVar220._0_4_ = auVar83._0_4_ * auVar82._0_4_ + fVar179 * auVar85._0_4_;
              auVar220._4_4_ = auVar83._4_4_ * auVar82._4_4_ + fVar179 * auVar85._4_4_;
              auVar220._8_4_ = auVar83._8_4_ * auVar82._8_4_ + fVar179 * auVar85._8_4_;
              auVar220._12_4_ = auVar83._12_4_ * auVar82._12_4_ + fVar179 * auVar85._12_4_;
              auVar82 = vsubps_avx(local_7a0._0_16_,auVar220);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(local_840._0_16_,auVar32);
              auVar85 = vucomiss_avx512f(auVar85);
              if (!(bool)uVar78 && !(bool)uVar79) {
                auVar85 = vaddss_avx512f(auVar90,auVar85);
                auVar85 = vfmadd231ss_fma(auVar85,local_740,ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(ZEXT416((uint)fVar179),auVar33);
                if (auVar83._0_4_ < auVar85._0_4_) {
                  fVar177 = auVar82._0_4_ + (float)local_750._0_4_;
                  if ((fVar177 < fVar210) ||
                     (fVar179 = *(float *)(ray + k * 4 + 0x100), fVar179 < fVar177)) break;
                  auVar85 = vmovshdup_avx(auVar82);
                  fVar181 = auVar85._0_4_;
                  if ((fVar181 < 0.0) || (1.0 < fVar181)) break;
                  auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_880._0_4_));
                  fVar151 = auVar85._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar75].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar151 = fVar151 * 1.5 +
                            (float)local_880._0_4_ * -0.5 * fVar151 * fVar151 * fVar151;
                  auVar221._0_4_ = auVar5._0_4_ * fVar151;
                  auVar221._4_4_ = auVar5._4_4_ * fVar151;
                  auVar221._8_4_ = auVar5._8_4_ * fVar151;
                  auVar221._12_4_ = auVar5._12_4_ * fVar151;
                  auVar83 = vfmadd213ps_fma(auVar88,auVar221,auVar86);
                  auVar85 = vshufps_avx(auVar221,auVar221,0xc9);
                  auVar5 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar222._0_4_ = auVar221._0_4_ * auVar5._0_4_;
                  auVar222._4_4_ = auVar221._4_4_ * auVar5._4_4_;
                  auVar222._8_4_ = auVar221._8_4_ * auVar5._8_4_;
                  auVar222._12_4_ = auVar221._12_4_ * auVar5._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar222,auVar86,auVar85);
                  auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar5 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar158._0_4_ = auVar83._0_4_ * auVar86._0_4_;
                  auVar158._4_4_ = auVar83._4_4_ * auVar86._4_4_;
                  auVar158._8_4_ = auVar83._8_4_ * auVar86._8_4_;
                  auVar158._12_4_ = auVar83._12_4_ * auVar86._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar158,auVar85,auVar5);
                  uVar165 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar177;
                    uVar8 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                    uVar8 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar165;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar181;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar75;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar225._8_4_ = 1;
                  auVar225._0_8_ = 0x100000001;
                  auVar225._12_4_ = 1;
                  auVar225._16_4_ = 1;
                  auVar225._20_4_ = 1;
                  auVar225._24_4_ = 1;
                  auVar225._28_4_ = 1;
                  local_3c0 = vpermps_avx2(auVar225,ZEXT1632(auVar82));
                  auVar106 = vpermps_avx2(auVar225,ZEXT1632(auVar85));
                  auVar232._8_4_ = 2;
                  auVar232._0_8_ = 0x200000002;
                  auVar232._12_4_ = 2;
                  auVar232._16_4_ = 2;
                  auVar232._20_4_ = 2;
                  auVar232._24_4_ = 2;
                  auVar232._28_4_ = 2;
                  local_400 = vpermps_avx2(auVar232,ZEXT1632(auVar85));
                  local_420[0] = (RTCHitN)auVar106[0];
                  local_420[1] = (RTCHitN)auVar106[1];
                  local_420[2] = (RTCHitN)auVar106[2];
                  local_420[3] = (RTCHitN)auVar106[3];
                  local_420[4] = (RTCHitN)auVar106[4];
                  local_420[5] = (RTCHitN)auVar106[5];
                  local_420[6] = (RTCHitN)auVar106[6];
                  local_420[7] = (RTCHitN)auVar106[7];
                  local_420[8] = (RTCHitN)auVar106[8];
                  local_420[9] = (RTCHitN)auVar106[9];
                  local_420[10] = (RTCHitN)auVar106[10];
                  local_420[0xb] = (RTCHitN)auVar106[0xb];
                  local_420[0xc] = (RTCHitN)auVar106[0xc];
                  local_420[0xd] = (RTCHitN)auVar106[0xd];
                  local_420[0xe] = (RTCHitN)auVar106[0xe];
                  local_420[0xf] = (RTCHitN)auVar106[0xf];
                  local_420[0x10] = (RTCHitN)auVar106[0x10];
                  local_420[0x11] = (RTCHitN)auVar106[0x11];
                  local_420[0x12] = (RTCHitN)auVar106[0x12];
                  local_420[0x13] = (RTCHitN)auVar106[0x13];
                  local_420[0x14] = (RTCHitN)auVar106[0x14];
                  local_420[0x15] = (RTCHitN)auVar106[0x15];
                  local_420[0x16] = (RTCHitN)auVar106[0x16];
                  local_420[0x17] = (RTCHitN)auVar106[0x17];
                  local_420[0x18] = (RTCHitN)auVar106[0x18];
                  local_420[0x19] = (RTCHitN)auVar106[0x19];
                  local_420[0x1a] = (RTCHitN)auVar106[0x1a];
                  local_420[0x1b] = (RTCHitN)auVar106[0x1b];
                  local_420[0x1c] = (RTCHitN)auVar106[0x1c];
                  local_420[0x1d] = (RTCHitN)auVar106[0x1d];
                  local_420[0x1e] = (RTCHitN)auVar106[0x1e];
                  local_420[0x1f] = (RTCHitN)auVar106[0x1f];
                  local_3e0 = uVar165;
                  uStack_3dc = uVar165;
                  uStack_3d8 = uVar165;
                  uStack_3d4 = uVar165;
                  uStack_3d0 = uVar165;
                  uStack_3cc = uVar165;
                  uStack_3c8 = uVar165;
                  uStack_3c4 = uVar165;
                  local_3a0 = ZEXT432(0) << 0x20;
                  local_380 = local_460._0_8_;
                  uStack_378 = local_460._8_8_;
                  uStack_370 = local_460._16_8_;
                  uStack_368 = local_460._24_8_;
                  local_360 = local_440;
                  auVar106 = vpcmpeqd_avx2(local_440,local_440);
                  local_848[1] = auVar106;
                  *local_848 = auVar106;
                  local_340 = pRVar10->instID[0];
                  uStack_33c = local_340;
                  uStack_338 = local_340;
                  uStack_334 = local_340;
                  uStack_330 = local_340;
                  uStack_32c = local_340;
                  uStack_328 = local_340;
                  uStack_324 = local_340;
                  local_320 = pRVar10->instPrimID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  *(float *)(ray + k * 4 + 0x100) = fVar177;
                  local_780 = local_4a0;
                  local_950.valid = (int *)local_780;
                  local_950.geometryUserPtr = pGVar9->userPtr;
                  local_950.context = context->user;
                  local_950.hit = local_420;
                  local_950.N = 8;
                  local_950.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar255 = ZEXT1664(auVar87);
                    (*pGVar9->intersectionFilterN)(&local_950);
                    auVar259 = ZEXT3264(local_920);
                    auVar258 = ZEXT3264(local_900);
                    auVar257 = ZEXT3264(local_8e0);
                    auVar256 = ZEXT3264(local_8c0);
                    auVar254 = ZEXT3264(local_8a0);
                  }
                  if (local_780 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      (*p_Var11)(&local_950);
                      auVar259 = ZEXT3264(local_920);
                      auVar258 = ZEXT3264(local_900);
                      auVar257 = ZEXT3264(local_8e0);
                      auVar256 = ZEXT3264(local_8c0);
                      auVar254 = ZEXT3264(local_8a0);
                    }
                    if (local_780 != (undefined1  [32])0x0) {
                      uVar80 = vptestmd_avx512vl(local_780,local_780);
                      iVar3 = *(int *)(local_950.hit + 4);
                      iVar4 = *(int *)(local_950.hit + 8);
                      iVar1 = *(int *)(local_950.hit + 0xc);
                      iVar58 = *(int *)(local_950.hit + 0x10);
                      iVar59 = *(int *)(local_950.hit + 0x14);
                      iVar60 = *(int *)(local_950.hit + 0x18);
                      iVar61 = *(int *)(local_950.hit + 0x1c);
                      bVar77 = (byte)uVar80;
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x180) =
                           (uint)(bVar77 & 1) * *(int *)local_950.hit |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_950.ray + 0x180);
                      *(uint *)(local_950.ray + 0x184) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x184);
                      *(uint *)(local_950.ray + 0x188) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x188);
                      *(uint *)(local_950.ray + 0x18c) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x18c);
                      *(uint *)(local_950.ray + 400) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 400);
                      *(uint *)(local_950.ray + 0x194) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x194);
                      *(uint *)(local_950.ray + 0x198) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x198);
                      *(uint *)(local_950.ray + 0x19c) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x19c);
                      iVar3 = *(int *)(local_950.hit + 0x24);
                      iVar4 = *(int *)(local_950.hit + 0x28);
                      iVar1 = *(int *)(local_950.hit + 0x2c);
                      iVar58 = *(int *)(local_950.hit + 0x30);
                      iVar59 = *(int *)(local_950.hit + 0x34);
                      iVar60 = *(int *)(local_950.hit + 0x38);
                      iVar61 = *(int *)(local_950.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1a0) =
                           (uint)(bVar77 & 1) * *(int *)(local_950.hit + 0x20) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_950.ray + 0x1a0);
                      *(uint *)(local_950.ray + 0x1a4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1a4);
                      *(uint *)(local_950.ray + 0x1a8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1a8);
                      *(uint *)(local_950.ray + 0x1ac) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1ac);
                      *(uint *)(local_950.ray + 0x1b0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1b0);
                      *(uint *)(local_950.ray + 0x1b4) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1b4);
                      *(uint *)(local_950.ray + 0x1b8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1b8);
                      *(uint *)(local_950.ray + 0x1bc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1bc);
                      iVar3 = *(int *)(local_950.hit + 0x44);
                      iVar4 = *(int *)(local_950.hit + 0x48);
                      iVar1 = *(int *)(local_950.hit + 0x4c);
                      iVar58 = *(int *)(local_950.hit + 0x50);
                      iVar59 = *(int *)(local_950.hit + 0x54);
                      iVar60 = *(int *)(local_950.hit + 0x58);
                      iVar61 = *(int *)(local_950.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1c0) =
                           (uint)(bVar77 & 1) * *(int *)(local_950.hit + 0x40) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_950.ray + 0x1c0);
                      *(uint *)(local_950.ray + 0x1c4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1c4);
                      *(uint *)(local_950.ray + 0x1c8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1c8);
                      *(uint *)(local_950.ray + 0x1cc) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1cc);
                      *(uint *)(local_950.ray + 0x1d0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1d0);
                      *(uint *)(local_950.ray + 0x1d4) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x1d4);
                      *(uint *)(local_950.ray + 0x1d8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1d8);
                      *(uint *)(local_950.ray + 0x1dc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1dc);
                      iVar3 = *(int *)(local_950.hit + 100);
                      iVar4 = *(int *)(local_950.hit + 0x68);
                      iVar1 = *(int *)(local_950.hit + 0x6c);
                      iVar58 = *(int *)(local_950.hit + 0x70);
                      iVar59 = *(int *)(local_950.hit + 0x74);
                      iVar60 = *(int *)(local_950.hit + 0x78);
                      iVar61 = *(int *)(local_950.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x1e0) =
                           (uint)(bVar77 & 1) * *(int *)(local_950.hit + 0x60) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_950.ray + 0x1e0);
                      *(uint *)(local_950.ray + 0x1e4) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1e4);
                      *(uint *)(local_950.ray + 0x1e8) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1e8);
                      *(uint *)(local_950.ray + 0x1ec) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x1ec);
                      *(uint *)(local_950.ray + 0x1f0) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x1f0);
                      *(uint *)(local_950.ray + 500) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 500);
                      *(uint *)(local_950.ray + 0x1f8) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x1f8);
                      *(uint *)(local_950.ray + 0x1fc) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x1fc);
                      iVar3 = *(int *)(local_950.hit + 0x84);
                      iVar4 = *(int *)(local_950.hit + 0x88);
                      iVar1 = *(int *)(local_950.hit + 0x8c);
                      iVar58 = *(int *)(local_950.hit + 0x90);
                      iVar59 = *(int *)(local_950.hit + 0x94);
                      iVar60 = *(int *)(local_950.hit + 0x98);
                      iVar61 = *(int *)(local_950.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar80 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar80 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar80 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                      bVar18 = SUB81(uVar80 >> 7,0);
                      *(uint *)(local_950.ray + 0x200) =
                           (uint)(bVar77 & 1) * *(int *)(local_950.hit + 0x80) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_950.ray + 0x200);
                      *(uint *)(local_950.ray + 0x204) =
                           (uint)bVar12 * iVar3 | (uint)!bVar12 * *(int *)(local_950.ray + 0x204);
                      *(uint *)(local_950.ray + 0x208) =
                           (uint)bVar13 * iVar4 | (uint)!bVar13 * *(int *)(local_950.ray + 0x208);
                      *(uint *)(local_950.ray + 0x20c) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_950.ray + 0x20c);
                      *(uint *)(local_950.ray + 0x210) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_950.ray + 0x210);
                      *(uint *)(local_950.ray + 0x214) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_950.ray + 0x214);
                      *(uint *)(local_950.ray + 0x218) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_950.ray + 0x218);
                      *(uint *)(local_950.ray + 0x21c) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_950.ray + 0x21c);
                      auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                      *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar106;
                      auVar106 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                      *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar106;
                      auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                      *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar106;
                      auVar106 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100));
                      *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar106;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar179;
                  break;
                }
              }
              lVar76 = lVar76 + -1;
            } while (lVar76 != 0);
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar162._4_4_ = uVar165;
            auVar162._0_4_ = uVar165;
            auVar162._8_4_ = uVar165;
            auVar162._12_4_ = uVar165;
            auVar162._16_4_ = uVar165;
            auVar162._20_4_ = uVar165;
            auVar162._24_4_ = uVar165;
            auVar162._28_4_ = uVar165;
            auVar63._4_4_ = fStack_4dc;
            auVar63._0_4_ = local_4e0;
            auVar63._8_4_ = fStack_4d8;
            auVar63._12_4_ = fStack_4d4;
            auVar63._16_4_ = fStack_4d0;
            auVar63._20_4_ = fStack_4cc;
            auVar63._24_4_ = fStack_4c8;
            auVar63._28_4_ = fStack_4c4;
            uVar21 = vcmpps_avx512vl(auVar162,auVar63,0xd);
            bVar68 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar68 & (byte)uVar21;
          } while (bVar68 != 0);
          auVar140 = local_500;
          fVar150 = (float)local_7e0._0_4_;
          fVar177 = (float)local_7e0._4_4_;
          fVar179 = fStack_7d8;
          fVar181 = fStack_7d4;
          fVar151 = fStack_7d0;
          fVar183 = fStack_7cc;
          fVar185 = fStack_7c8;
          fVar209 = fStack_7c4;
        }
        auVar233 = ZEXT3264(local_800);
        uVar22 = vpcmpgtd_avx512vl(auVar140,local_480);
        uVar23 = vpcmpd_avx512vl(local_480,local_2a0,1);
        auVar207._0_4_ = fVar150 + (float)local_200._0_4_;
        auVar207._4_4_ = fVar177 + (float)local_200._4_4_;
        auVar207._8_4_ = fVar179 + fStack_1f8;
        auVar207._12_4_ = fVar181 + fStack_1f4;
        auVar207._16_4_ = fVar151 + fStack_1f0;
        auVar207._20_4_ = fVar183 + fStack_1ec;
        auVar207._24_4_ = fVar185 + fStack_1e8;
        auVar207._28_4_ = fVar209 + fStack_1e4;
        uVar21 = vcmpps_avx512vl(auVar207,auVar162,2);
        bVar73 = bVar73 & (byte)uVar23 & (byte)uVar21;
        auVar208._0_4_ = fVar150 + local_300._0_4_;
        auVar208._4_4_ = fVar177 + local_300._4_4_;
        auVar208._8_4_ = fVar179 + local_300._8_4_;
        auVar208._12_4_ = fVar181 + local_300._12_4_;
        auVar208._16_4_ = fVar151 + local_300._16_4_;
        auVar208._20_4_ = fVar183 + local_300._20_4_;
        auVar208._24_4_ = fVar185 + local_300._24_4_;
        auVar208._28_4_ = fVar209 + local_300._28_4_;
        uVar21 = vcmpps_avx512vl(auVar208,auVar162,2);
        bVar66 = bVar66 & (byte)uVar22 & (byte)uVar21 | bVar73;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar261 = ZEXT3264(auVar106);
        auVar244 = ZEXT3264(local_640);
        prim = local_6f0;
        if (bVar66 != 0) {
          abStack_180[uVar71 * 0x60] = bVar66;
          auVar142._0_4_ =
               (uint)(bVar73 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar73 & 1) * (int)local_300._0_4_;
          bVar12 = (bool)(bVar73 >> 1 & 1);
          auVar142._4_4_ = (uint)bVar12 * local_200._4_4_ | (uint)!bVar12 * (int)local_300._4_4_;
          bVar12 = (bool)(bVar73 >> 2 & 1);
          auVar142._8_4_ = (uint)bVar12 * (int)fStack_1f8 | (uint)!bVar12 * (int)local_300._8_4_;
          bVar12 = (bool)(bVar73 >> 3 & 1);
          auVar142._12_4_ = (uint)bVar12 * (int)fStack_1f4 | (uint)!bVar12 * (int)local_300._12_4_;
          bVar12 = (bool)(bVar73 >> 4 & 1);
          auVar142._16_4_ = (uint)bVar12 * (int)fStack_1f0 | (uint)!bVar12 * (int)local_300._16_4_;
          bVar12 = (bool)(bVar73 >> 5 & 1);
          auVar142._20_4_ = (uint)bVar12 * (int)fStack_1ec | (uint)!bVar12 * (int)local_300._20_4_;
          auVar142._24_4_ =
               (uint)(bVar73 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar73 >> 6) * (int)local_300._24_4_;
          auVar142._28_4_ = local_300._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar142;
          uVar80 = vmovlps_avx(local_4b0);
          (&uStack_140)[uVar71 * 0xc] = uVar80;
          aiStack_138[uVar71 * 0x18] = iVar74 + 1;
          uVar71 = (ulong)((int)uVar71 + 1);
        }
      }
    }
    do {
      uVar81 = (uint)uVar71;
      uVar71 = (ulong)(uVar81 - 1);
      if (uVar81 == 0) {
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar39._4_4_ = uVar165;
        auVar39._0_4_ = uVar165;
        auVar39._8_4_ = uVar165;
        auVar39._12_4_ = uVar165;
        auVar39._16_4_ = uVar165;
        auVar39._20_4_ = uVar165;
        auVar39._24_4_ = uVar165;
        auVar39._28_4_ = uVar165;
        uVar21 = vcmpps_avx512vl(local_280,auVar39,2);
        uVar75 = (uint)uVar21 & (uint)local_6e8 - 1 & (uint)local_6e8;
        local_6e8 = (ulong)uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_01cdf38b;
      }
      lVar76 = uVar71 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar173._0_4_ = fVar150 + auVar106._0_4_;
      auVar173._4_4_ = fVar177 + auVar106._4_4_;
      auVar173._8_4_ = fVar179 + auVar106._8_4_;
      auVar173._12_4_ = fVar181 + auVar106._12_4_;
      auVar173._16_4_ = fVar151 + auVar106._16_4_;
      auVar173._20_4_ = fVar183 + auVar106._20_4_;
      auVar173._24_4_ = fVar185 + auVar106._24_4_;
      auVar173._28_4_ = fVar209 + auVar106._28_4_;
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar38._4_4_ = uVar165;
      auVar38._0_4_ = uVar165;
      auVar38._8_4_ = uVar165;
      auVar38._12_4_ = uVar165;
      auVar38._16_4_ = uVar165;
      auVar38._20_4_ = uVar165;
      auVar38._24_4_ = uVar165;
      auVar38._28_4_ = uVar165;
      uVar21 = vcmpps_avx512vl(auVar173,auVar38,2);
      uVar70 = (uint)uVar21 & (uint)abStack_180[lVar76];
    } while (uVar70 == 0);
    uVar80 = (&uStack_140)[uVar71 * 0xc];
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar80;
    auVar205._8_4_ = 0x7f800000;
    auVar205._0_8_ = 0x7f8000007f800000;
    auVar205._12_4_ = 0x7f800000;
    auVar205._16_4_ = 0x7f800000;
    auVar205._20_4_ = 0x7f800000;
    auVar205._24_4_ = 0x7f800000;
    auVar205._28_4_ = 0x7f800000;
    auVar107 = vblendmps_avx512vl(auVar205,auVar106);
    bVar66 = (byte)uVar70;
    auVar138._0_4_ =
         (uint)(bVar66 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)auVar106._0_4_;
    bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
    auVar138._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * (int)auVar106._4_4_;
    bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
    auVar138._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * (int)auVar106._8_4_;
    bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
    auVar138._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * (int)auVar106._12_4_;
    bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
    auVar138._16_4_ = (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * (int)auVar106._16_4_;
    bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
    auVar138._20_4_ = (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * (int)auVar106._20_4_;
    bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
    auVar138._24_4_ = (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * (int)auVar106._24_4_;
    auVar138._28_4_ =
         (uVar70 >> 7) * auVar107._28_4_ | (uint)!SUB41(uVar70 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar138,auVar138,0xb1);
    auVar106 = vminps_avx(auVar138,auVar106);
    auVar107 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar107);
    auVar107 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar107);
    uVar21 = vcmpps_avx512vl(auVar138,auVar106,0);
    bVar68 = (byte)uVar21 & bVar66;
    if (bVar68 != 0) {
      uVar70 = (uint)bVar68;
    }
    uVar143 = 0;
    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    iVar74 = aiStack_138[uVar71 * 0x18];
    bVar66 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar66;
    abStack_180[lVar76] = bVar66;
    if (bVar66 == 0) {
      uVar81 = uVar81 - 1;
    }
    uVar165 = (undefined4)uVar80;
    auVar159._4_4_ = uVar165;
    auVar159._0_4_ = uVar165;
    auVar159._8_4_ = uVar165;
    auVar159._12_4_ = uVar165;
    auVar159._16_4_ = uVar165;
    auVar159._20_4_ = uVar165;
    auVar159._24_4_ = uVar165;
    auVar159._28_4_ = uVar165;
    auVar82 = vmovshdup_avx(auVar166);
    auVar82 = vsubps_avx(auVar82,auVar166);
    auVar174._0_4_ = auVar82._0_4_;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar82 = vfmadd132ps_fma(auVar174,auVar159,_DAT_01faff20);
    auVar106 = ZEXT1632(auVar82);
    local_420[0] = (RTCHitN)auVar106[0];
    local_420[1] = (RTCHitN)auVar106[1];
    local_420[2] = (RTCHitN)auVar106[2];
    local_420[3] = (RTCHitN)auVar106[3];
    local_420[4] = (RTCHitN)auVar106[4];
    local_420[5] = (RTCHitN)auVar106[5];
    local_420[6] = (RTCHitN)auVar106[6];
    local_420[7] = (RTCHitN)auVar106[7];
    local_420[8] = (RTCHitN)auVar106[8];
    local_420[9] = (RTCHitN)auVar106[9];
    local_420[10] = (RTCHitN)auVar106[10];
    local_420[0xb] = (RTCHitN)auVar106[0xb];
    local_420[0xc] = (RTCHitN)auVar106[0xc];
    local_420[0xd] = (RTCHitN)auVar106[0xd];
    local_420[0xe] = (RTCHitN)auVar106[0xe];
    local_420[0xf] = (RTCHitN)auVar106[0xf];
    local_420[0x10] = (RTCHitN)auVar106[0x10];
    local_420[0x11] = (RTCHitN)auVar106[0x11];
    local_420[0x12] = (RTCHitN)auVar106[0x12];
    local_420[0x13] = (RTCHitN)auVar106[0x13];
    local_420[0x14] = (RTCHitN)auVar106[0x14];
    local_420[0x15] = (RTCHitN)auVar106[0x15];
    local_420[0x16] = (RTCHitN)auVar106[0x16];
    local_420[0x17] = (RTCHitN)auVar106[0x17];
    local_420[0x18] = (RTCHitN)auVar106[0x18];
    local_420[0x19] = (RTCHitN)auVar106[0x19];
    local_420[0x1a] = (RTCHitN)auVar106[0x1a];
    local_420[0x1b] = (RTCHitN)auVar106[0x1b];
    local_420[0x1c] = (RTCHitN)auVar106[0x1c];
    local_420[0x1d] = (RTCHitN)auVar106[0x1d];
    local_420[0x1e] = (RTCHitN)auVar106[0x1e];
    local_420[0x1f] = (RTCHitN)auVar106[0x1f];
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_420 + (ulong)uVar143 * 4);
    uVar71 = (ulong)uVar81;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }